

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *atlas)

{
  undefined4 uVar1;
  stbtt__point sVar2;
  stbtt__point sVar3;
  undefined4 uVar4;
  stbtt_uint8 sVar5;
  byte bVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  ImFont *pIVar9;
  stbrp_node *data;
  ImFontConfig *pIVar10;
  long lVar11;
  char cVar12;
  char cVar17;
  size_t size;
  undefined1 auVar25 [16];
  stbtt__buf fontdict;
  undefined1 auVar26 [14];
  undefined1 auVar27 [12];
  unkuint10 Var28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  unkbyte10 Var32;
  undefined1 auVar33 [13];
  undefined1 auVar34 [11];
  undefined1 auVar35 [14];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [14];
  undefined1 auVar39 [16];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  uint6 uVar45;
  ushort uVar46;
  short sVar47;
  stbtt_uint32 sVar48;
  stbtt__active_edge *z;
  long lVar53;
  stbtt_uint32 sVar49;
  stbtt_uint32 sVar50;
  stbtt_uint32 sVar51;
  stbrp_context *ptr;
  stbrp_node *psVar54;
  ImFontConfig *pIVar55;
  stbtt_uint32 sVar52;
  stbrp_node *psVar56;
  void *pvVar57;
  void *pvVar58;
  void *__s;
  uchar *puVar59;
  stbtt__point *psVar60;
  stbtt__point *points;
  long lVar61;
  stbtt__edge *psVar62;
  float *pfVar63;
  stbtt__buf *psVar64;
  stbtt__buf *psVar65;
  undefined8 *puVar66;
  stbtt__buf *psVar67;
  float *pfVar68;
  bool bVar69;
  uint uVar70;
  uint uVar71;
  ulong uVar72;
  int iVar73;
  long lVar74;
  ulong uVar75;
  undefined8 *puVar76;
  uint uVar77;
  undefined1 auVar78 [8];
  short *psVar79;
  bool bVar80;
  uchar uVar81;
  ImWchar IVar82;
  short sVar83;
  ulong uVar84;
  stbtt__edge *psVar85;
  uint uVar86;
  ImWchar *pIVar87;
  ulong uVar88;
  byte *pbVar89;
  stbtt__edge *psVar90;
  int iVar91;
  stbrp_node **ppsVar92;
  long lVar93;
  int iVar94;
  ulong uVar95;
  size_t size_00;
  byte *pbVar96;
  stbtt_fontinfo *psVar97;
  stbtt__active_edge *e;
  long lVar98;
  uint uVar99;
  void *p;
  stbtt__buf *psVar100;
  bool bVar101;
  byte bVar102;
  char cVar108;
  float fVar103;
  char cVar106;
  char cVar107;
  undefined1 auVar104 [16];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  undefined1 in_XMM2 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  undefined1 in_XMM3 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  float fVar132;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  int iVar133;
  float fVar134;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar140;
  float fVar141;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar142;
  undefined4 uVar143;
  uint uVar151;
  uint uVar153;
  undefined1 auVar148 [16];
  float fVar152;
  float fVar154;
  uint uVar155;
  float fVar156;
  undefined1 auVar149 [16];
  float fVar157;
  uint uVar165;
  uint uVar167;
  undefined1 auVar159 [16];
  float fVar158;
  float fVar166;
  float fVar168;
  uint uVar169;
  float fVar170;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  short sVar171;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar188 [16];
  stbtt__buf sVar192;
  stbtt_uint32 charstrings;
  float y0_2;
  int x0_1;
  stbtt_uint32 fdarrayoff;
  stbtt_uint32 cstype;
  int y0;
  int y0_1;
  int x1_1;
  int x0;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  ImFontAtlas *pIVar193;
  int *local_4a0;
  undefined8 in_stack_fffffffffffffb70;
  stbtt_uint32 local_480;
  float local_47c;
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  int *local_450;
  long local_448;
  stbtt_uint32 local_440;
  stbtt_uint32 local_43c;
  ulong local_438;
  undefined8 local_430;
  undefined1 local_428 [16];
  stbrp_node *local_418;
  stbtt_fontinfo *local_410;
  stbtt__point *local_408;
  undefined8 local_400;
  stbtt_uint32 local_3f4;
  ulong local_3f0;
  stbtt__buf local_3e8;
  float *local_3d8;
  stbtt__point *local_3d0;
  uint local_3c4;
  undefined8 *local_3c0;
  ulong local_3b8;
  stbtt_pack_context local_3b0;
  float local_378;
  undefined4 uStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  void *local_368;
  ulong local_360;
  long local_358;
  long local_350;
  uint local_344;
  uint local_340;
  int local_33c;
  undefined1 local_338 [16];
  void *local_328;
  void *local_320;
  float *local_318;
  long local_310;
  long local_308;
  uchar *local_300;
  long local_2f8;
  ImFontConfig *local_2f0;
  long local_2e8;
  stbtt__edge *local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  size_t local_2b8;
  size_t local_2b0;
  ulong local_2a8;
  short *local_2a0;
  long local_298;
  int local_290;
  int local_28c;
  ulong local_288;
  undefined8 uStack_280;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [12];
  int iStack_22c;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  undefined1 auVar105 [16];
  ushort uVar116;
  undefined6 uVar144;
  undefined8 uVar145;
  undefined1 auVar146 [12];
  undefined1 auVar147 [14];
  undefined1 auVar150 [16];
  undefined4 uVar172;
  undefined6 uVar173;
  undefined8 uVar174;
  undefined1 auVar175 [12];
  undefined1 auVar176 [14];
  undefined1 auVar180 [16];
  
  if ((atlas->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x69d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildRegisterDefaultCustomRects(atlas);
  atlas->TexID = (ImTextureID)0x0;
  atlas->TexWidth = 0;
  atlas->TexHeight = 0;
  (atlas->TexUvScale).x = 0.0;
  (atlas->TexUvScale).y = 0.0;
  (atlas->TexUvWhitePixel).x = 0.0;
  (atlas->TexUvWhitePixel).y = 0.0;
  ImFontAtlas::ClearTexData(atlas);
  lVar53 = (long)(atlas->ConfigData).Size;
  if (lVar53 < 1) {
    local_438 = 0;
    iVar73 = 0x200;
    if (0 < atlas->TexDesiredWidth) {
      iVar73 = atlas->TexDesiredWidth;
    }
    local_378 = 0.0;
  }
  else {
    pIVar55 = (atlas->ConfigData).Data;
    lVar74 = 0;
    local_438 = 0;
    local_378 = 0.0;
    do {
      pIVar87 = pIVar55[lVar74].GlyphRanges;
      if (pIVar87 == (ushort *)0x0) {
        pIVar55[lVar74].GlyphRanges = ImFontAtlas::GetGlyphRangesDefault::ranges;
        pIVar87 = ImFontAtlas::GetGlyphRangesDefault::ranges;
      }
      uVar46 = *pIVar87;
      while (iVar94 = (int)local_438, uVar46 != 0) {
        if (pIVar87[1] == 0) break;
        local_438 = (ulong)((iVar94 - (uint)uVar46) + (uint)pIVar87[1] + 1);
        local_378 = (float)((int)local_378 + 1);
        uVar46 = pIVar87[2];
        pIVar87 = pIVar87 + 2;
      }
      lVar74 = lVar74 + 1;
    } while (lVar74 != lVar53);
    iVar73 = atlas->TexDesiredWidth;
    if (((iVar73 < 1) && (iVar73 = 0x1000, iVar94 < 0xfa1)) && (iVar73 = 0x800, iVar94 < 0x7d1)) {
      iVar73 = (uint)(1000 < iVar94) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar73;
  atlas->TexHeight = 0;
  local_3b0.h_oversample = 0;
  local_3b0.v_oversample = 0;
  uVar86 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  uVar77 = iVar73 - uVar86;
  psVar54 = (stbrp_node *)ImGui::MemAlloc((long)(int)uVar77 << 4);
  auVar148 = _DAT_001b5790;
  auVar111 = _DAT_001aaa50;
  if ((ptr == (stbrp_context *)0x0) || (psVar54 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psVar54 != (stbrp_node *)0x0) {
LAB_0017ee22:
      ImGui::MemFree(psVar54);
    }
    bVar101 = false;
  }
  else {
    local_3b0.user_allocator_context = (void *)0x0;
    local_3b0.height = 0x8000;
    local_3b0.pixels = (uchar *)0x0;
    local_3b0.pack_info = ptr;
    local_3b0.width = iVar73;
    local_3b0.stride_in_bytes = iVar73;
    local_3b0.padding = uVar86;
    local_3b0.nodes = psVar54;
    if (((int)uVar86 < -0x7fff) || (0xffff < (int)uVar77)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                    ,0x100,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar72 = (ulong)(uVar77 - 1);
    if ((int)uVar77 < 2) {
      uVar72 = 0;
      auVar111 = in_XMM2;
    }
    else {
      uVar84 = (ulong)(uVar77 & 0x7ffffffe);
      lVar53 = uVar72 - 1;
      auVar104._8_4_ = (int)lVar53;
      auVar104._0_8_ = lVar53;
      auVar104._12_4_ = (int)((ulong)lVar53 >> 0x20);
      ppsVar92 = &psVar54[1].next;
      auVar104 = auVar104 ^ _DAT_001aaa50;
      in_XMM3._8_4_ = 0xffffffff;
      in_XMM3._0_8_ = 0xffffffffffffffff;
      in_XMM3._12_4_ = 0xffffffff;
      auVar159 = _DAT_001aaa40;
      do {
        auVar128 = auVar159 ^ auVar111;
        auVar135._0_4_ = -(uint)(auVar104._0_4_ < auVar128._0_4_);
        auVar135._4_4_ = -(uint)(auVar104._4_4_ < auVar128._4_4_);
        auVar135._8_4_ = -(uint)(auVar104._8_4_ < auVar128._8_4_);
        auVar135._12_4_ = -(uint)(auVar104._12_4_ < auVar128._12_4_);
        auVar129._4_4_ = -(uint)(auVar128._4_4_ == auVar104._4_4_);
        auVar129._12_4_ = -(uint)(auVar128._12_4_ == auVar104._12_4_);
        auVar129._0_4_ = auVar129._4_4_;
        auVar129._8_4_ = auVar129._12_4_;
        auVar128._4_4_ = auVar135._4_4_;
        auVar128._0_4_ = auVar135._4_4_;
        auVar128._8_4_ = auVar135._12_4_;
        auVar128._12_4_ = auVar135._12_4_;
        auVar128 = auVar128 | auVar129 & auVar135;
        lVar53 = auVar159._8_8_;
        if ((~auVar128._0_4_ & 1) != 0) {
          ppsVar92[-2] = psVar54 + auVar159._0_8_ + 1;
        }
        if (((auVar128 ^ in_XMM3) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *ppsVar92 = psVar54 + (lVar53 - in_XMM3._8_8_);
        }
        auVar159._0_8_ = auVar159._0_8_ + auVar148._0_8_;
        auVar159._8_8_ = lVar53 + auVar148._8_8_;
        ppsVar92 = ppsVar92 + 4;
        uVar84 = uVar84 - 2;
      } while (uVar84 != 0);
    }
    psVar54[uVar72].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psVar54;
    ptr->active_head = ptr->extra;
    ptr->width = uVar77;
    ptr->height = 0x8000 - uVar86;
    ptr->num_nodes = uVar77;
    ptr->align = (int)((uVar77 - 1) + uVar77) / (int)uVar77;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)uVar77;
    ptr->extra[1].y = 0xffff;
    uVar86 = 0;
    ptr->extra[1].next = (stbrp_node *)0x0;
    local_3b0.h_oversample = 1;
    local_3b0.v_oversample = 1;
    ImFontAtlasBuildPackCustomRects(atlas,ptr);
    local_418 = (stbrp_node *)ImGui::MemAlloc((long)(atlas->ConfigData).Size * 0xc0);
    if (0 < (atlas->ConfigData).Size) {
      lVar53 = 0;
      do {
        psVar54 = local_418;
        pIVar55 = (atlas->ConfigData).Data;
        pIVar9 = pIVar55[lVar53].DstFont;
        if ((pIVar9 == (ImFont *)0x0) ||
           (pIVar193 = pIVar9->ContainerAtlas, pIVar193 != atlas && pIVar193 != (ImFontAtlas *)0x0))
        {
          __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x6d0,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        pIVar55 = pIVar55 + lVar53;
        data = (stbrp_node *)pIVar55->FontData;
        iVar73 = pIVar55->FontNo;
        bVar102 = (byte)data->x;
        if (bVar102 < 0x4f) {
          if (bVar102 == 0) {
            if (*(stbtt_uint8 *)((long)&data->x + 1) != '\x01') goto LAB_0017ef52;
          }
          else if ((bVar102 != 0x31) || (*(stbtt_uint8 *)((long)&data->x + 1) != '\0'))
          goto LAB_0017ef52;
          if (((char)data->y != '\0') || (*(char *)((long)&data->y + 1) != '\0')) goto LAB_0017ef52;
LAB_0017c2c7:
          sVar52 = -(uint)(iVar73 != 0);
        }
        else {
          if (bVar102 == 0x4f) {
            if (((*(stbtt_uint8 *)((long)&data->x + 1) != 'T') || ((char)data->y != 'T')) ||
               (*(char *)((long)&data->y + 1) != 'O')) goto LAB_0017ef52;
            goto LAB_0017c2c7;
          }
          if (bVar102 != 0x74) goto LAB_0017ef52;
          sVar5 = *(stbtt_uint8 *)((long)&data->x + 1);
          if (sVar5 == 'r') {
            if (((char)data->y != 'u') || (*(char *)((long)&data->y + 1) != 'e')) goto LAB_0017ef52;
            goto LAB_0017c2c7;
          }
          if (sVar5 != 't') {
            if (((sVar5 != 'y') || ((char)data->y != 'p')) || (*(char *)((long)&data->y + 1) != '1')
               ) goto LAB_0017ef52;
            goto LAB_0017c2c7;
          }
          if (((char)data->y != 'c') || (*(char *)((long)&data->y + 1) != 'f')) goto LAB_0017ef52;
          uVar77 = *(uint *)&data->field_0x4;
          uVar77 = uVar77 >> 0x18 | (uVar77 & 0xff0000) >> 8 | (uVar77 & 0xff00) << 8 |
                   uVar77 << 0x18;
          if (((uVar77 != 0x20000) && (uVar77 != 0x10000)) ||
             (uVar77 = *(uint *)&data->next,
             (int)(uVar77 >> 0x18 | (uVar77 & 0xff0000) >> 8 | (uVar77 & 0xff00) << 8 |
                  uVar77 << 0x18) <= iVar73)) goto LAB_0017ef52;
          uVar77 = *(uint *)((long)&data->next + (long)iVar73 * 4 + 4);
          sVar52 = uVar77 >> 0x18 | (uVar77 & 0xff0000) >> 8 | (uVar77 & 0xff00) << 8 |
                   uVar77 << 0x18;
        }
        if ((int)sVar52 < 0) {
LAB_0017ef52:
          __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x6d3,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        local_418[lVar53 * 0xc].next = data;
        local_418[lVar53 * 0xc + 1].x = (short)sVar52;
        local_418[lVar53 * 0xc + 1].y = (short)(sVar52 >> 0x10);
        psVar56 = local_418 + lVar53 * 0xc + 4;
        psVar56->x = 0;
        psVar56->y = 0;
        *(undefined4 *)&psVar56->field_0x4 = 0;
        psVar56->next = (stbrp_node *)0x0;
        sVar48 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"cmap");
        sVar49 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"loca");
        local_428._0_4_ = sVar49;
        *(stbtt_uint32 *)&psVar54[lVar53 * 0xc + 1].next = sVar49;
        sVar49 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"head");
        local_468._0_4_ = sVar49;
        *(stbtt_uint32 *)((long)&psVar54[lVar53 * 0xc + 1].next + 4) = sVar49;
        sVar49 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"glyf");
        local_478._0_4_ = sVar49;
        psVar54[lVar53 * 0xc + 2].x = (short)sVar49;
        psVar54[lVar53 * 0xc + 2].y = (short)(sVar49 >> 0x10);
        sVar49 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"hhea");
        *(stbtt_uint32 *)&psVar54[lVar53 * 0xc + 2].field_0x4 = sVar49;
        sVar50 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"hmtx");
        *(stbtt_uint32 *)&psVar54[lVar53 * 0xc + 2].next = sVar50;
        sVar51 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"kern");
        *(stbtt_uint32 *)((long)&psVar54[lVar53 * 0xc + 2].next + 4) = sVar51;
        sVar51 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"GPOS");
        psVar54[lVar53 * 0xc + 3].x = (short)sVar51;
        psVar54[lVar53 * 0xc + 3].y = (short)(sVar51 >> 0x10);
        if ((((sVar48 == 0) || (local_468._0_4_ == 0)) || (sVar49 == 0)) || (sVar50 == 0)) {
LAB_0017ee12:
          atlas->TexWidth = 0;
          atlas->TexHeight = 0;
          psVar54 = local_418;
          goto LAB_0017ee22;
        }
        if (local_478._0_4_ == 0) {
          local_468 = (undefined1  [8])CONCAT44(0,sVar48);
          local_400._0_4_ = 2;
          local_480 = 0;
          local_43c = 0;
          uVar86 = 0;
          iVar73 = 0;
          local_440 = 0;
          sVar48 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"CFF ");
          if (sVar48 != 0) {
            psVar56 = psVar54 + lVar53 * 0xc + 9;
            psVar56->x = 0;
            psVar56->y = 0;
            *(undefined4 *)&psVar56->field_0x4 = 0;
            psVar56->next = (stbrp_node *)0x0;
            psVar56 = psVar54 + lVar53 * 0xc + 8;
            psVar56->x = 0;
            psVar56->y = 0;
            *(undefined4 *)&psVar56->field_0x4 = 0;
            psVar56->next = (stbrp_node *)0x0;
            *(stbtt_uint8 **)(psVar54 + lVar53 * 0xc + 4) =
                 (stbtt_uint8 *)((long)&data->x + (ulong)sVar48);
            psVar54[lVar53 * 0xc + 4].next = (stbrp_node *)0x2000000000000000;
            local_238._0_8_ = *(undefined8 *)(psVar54 + lVar53 * 0xc + 4);
            psVar56 = psVar54[lVar53 * 0xc + 4].next;
            local_238._8_4_ = SUB84(psVar56,0);
            if ((int)local_238._8_4_ < -2) goto LAB_0017efaf;
            iStack_22c = (int)((ulong)psVar56 >> 0x20);
            uVar77 = local_238._8_4_ + 2;
            if (iStack_22c < (int)uVar77) goto LAB_0017efaf;
            uVar99 = 0;
            if ((int)uVar77 < iStack_22c) {
              uVar99 = (uint)*(byte *)(local_238._0_8_ + (ulong)uVar77);
            }
            if (iStack_22c < (int)uVar99) goto LAB_0017efaf;
            stack0xfffffffffffffdd0 = (stbrp_node *)CONCAT44(iStack_22c,uVar99);
            stbtt__cff_get_index((stbtt__buf *)local_238);
            sVar192 = stbtt__cff_get_index((stbtt__buf *)local_238);
            local_3e8 = stbtt__cff_index_get(sVar192,0);
            stbtt__cff_get_index((stbtt__buf *)local_238);
            sVar192 = stbtt__cff_get_index((stbtt__buf *)local_238);
            *(stbtt__buf *)(psVar54 + lVar53 * 0xc + 6) = sVar192;
            stbtt__dict_get_ints(&local_3e8,0x11,1,&local_480);
            stbtt__dict_get_ints(&local_3e8,0x106,1,(stbtt_uint32 *)&local_400);
            stbtt__dict_get_ints(&local_3e8,0x124,1,&local_43c);
            stbtt__dict_get_ints(&local_3e8,0x125,1,&local_440);
            psVar56 = stack0xfffffffffffffdd0;
            sVar192.data._4_4_ = in_stack_fffffffffffffb4c;
            sVar192.data._0_4_ = in_stack_fffffffffffffb48;
            sVar192._8_8_ = atlas;
            fontdict.cursor = uVar86;
            fontdict.data = (uchar *)in_stack_fffffffffffffb70;
            fontdict.size = iVar73;
            sVar192 = stbtt__get_subrs(sVar192,fontdict);
            sVar49 = local_440;
            sVar48 = local_480;
            *(stbtt__buf *)(psVar54 + lVar53 * 0xc + 7) = sVar192;
            if (((stbtt_uint32)local_400 == 2) && (local_480 != 0)) {
              iVar73 = (int)((ulong)psVar56 >> 0x20);
              if (local_43c != 0) {
                uVar72 = (ulong)local_440;
                if (uVar72 == 0) goto LAB_0017ee12;
                psVar56 = stack0xfffffffffffffdd0;
                if (((int)local_43c < 0) || (iVar73 < (int)local_43c)) goto LAB_0017efaf;
                stack0xfffffffffffffdd0 = (stbrp_node *)CONCAT44(iStack_22c,local_43c);
                sVar192 = stbtt__cff_get_index((stbtt__buf *)local_238);
                *(stbtt__buf *)(psVar54 + lVar53 * 0xc + 8) = sVar192;
                bVar101 = (int)(iStack_22c - sVar49 | sVar49) < 0;
                puVar59 = (uchar *)(local_238._0_8_ + uVar72);
                psVar56 = (stbrp_node *)((ulong)(iStack_22c - sVar49) << 0x20);
                if (bVar101 || iStack_22c < (int)sVar49) {
                  puVar59 = (uchar *)0x0;
                }
                uVar86 = 0;
                if (bVar101 || iStack_22c < (int)sVar49) {
                  psVar56 = (stbrp_node *)0x0;
                }
                *(uchar **)(psVar54 + lVar53 * 0xc + 9) = puVar59;
                psVar54[lVar53 * 0xc + 9].next = psVar56;
                iVar73 = iStack_22c;
              }
              psVar56 = stack0xfffffffffffffdd0;
              if (((int)sVar48 < 0) || (iVar73 < (int)sVar48)) {
LAB_0017efaf:
                stack0xfffffffffffffdd0 = psVar56;
                __assert_fail("!(o > b->size || o < 0)",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                              ,0x45c,"void stbtt__buf_seek(stbtt__buf *, int)");
              }
              stack0xfffffffffffffdd0 = (stbrp_node *)CONCAT44(iStack_22c,sVar48);
              sVar192 = stbtt__cff_get_index((stbtt__buf *)local_238);
              *(stbtt__buf *)(psVar54 + lVar53 * 0xc + 5) = sVar192;
              auVar78 = local_468;
              goto LAB_0017c6a2;
            }
          }
          goto LAB_0017ee12;
        }
        auVar78 = (undefined1  [8])CONCAT44(0,sVar48);
        if (local_428._0_4_ == 0) goto LAB_0017ee12;
LAB_0017c6a2:
        sVar52 = stbtt__find_table((stbtt_uint8 *)data,sVar52,"maxp");
        if (sVar52 == 0) {
          uVar77 = 0xffff;
        }
        else {
          uVar77 = (uint)(ushort)(*(ushort *)(&data->field_0x4 + sVar52) << 8 |
                                 *(ushort *)(&data->field_0x4 + sVar52) >> 8);
        }
        *(uint *)&psVar54[lVar53 * 0xc + 1].field_0x4 = uVar77;
        uVar46 = *(ushort *)((long)&data->y + ((ulong)auVar78 & 0xffffffff));
        uVar46 = uVar46 << 8 | uVar46 >> 8;
        *(undefined4 *)&psVar54[lVar53 * 0xc + 3].field_0x4 = 0;
        if (uVar46 == 0) goto LAB_0017ee12;
        uVar77 = SUB84(auVar78,0) + 4;
        uVar72 = (ulong)uVar46;
        iVar73 = 0;
        do {
          uVar84 = (ulong)uVar77;
          uVar46 = *(ushort *)((long)&data->x + uVar84);
          uVar46 = uVar46 << 8 | uVar46 >> 8;
          if ((uVar46 == 0) ||
             ((uVar46 == 3 &&
              ((uVar46 = *(ushort *)((long)&data->y + uVar84), uVar46 = uVar46 << 8 | uVar46 >> 8,
               uVar46 == 10 || (uVar46 == 1)))))) {
            uVar99 = *(uint *)(&data->field_0x4 + uVar84);
            iVar73 = (uVar99 >> 0x18 | (uVar99 & 0xff0000) >> 8 | (uVar99 & 0xff00) << 8 |
                     uVar99 << 0x18) + SUB84(auVar78,0);
            *(int *)&psVar54[lVar53 * 0xc + 3].field_0x4 = iVar73;
          }
          uVar77 = uVar77 + 8;
          uVar72 = uVar72 - 1;
        } while (uVar72 != 0);
        if (iVar73 == 0) goto LAB_0017ee12;
        uVar46 = *(ushort *)
                  ((long)&data[3].y + (long)*(int *)((long)&psVar54[lVar53 * 0xc + 1].next + 4));
        *(uint *)&psVar54[lVar53 * 0xc + 3].next = (uint)(ushort)(uVar46 << 8 | uVar46 >> 8);
        lVar53 = lVar53 + 1;
      } while (lVar53 < (atlas->ConfigData).Size);
    }
    lVar53 = (long)(int)local_438;
    size = lVar53 * 0x1c;
    pvVar57 = ImGui::MemAlloc(size);
    size_00 = lVar53 << 4;
    pvVar58 = ImGui::MemAlloc(size_00);
    lVar53 = (long)(int)local_378;
    __s = ImGui::MemAlloc(lVar53 * 0x28);
    memset(pvVar57,0,size);
    local_320 = pvVar58;
    memset(pvVar58,0,size_00);
    local_368 = __s;
    memset(__s,0,lVar53 * 0x28);
    uVar77 = local_430._4_4_;
    uVar72 = (ulong)uVar86;
    iVar73 = 0;
    local_430 = (ulong)local_430._4_4_ << 0x20;
    local_328 = pvVar57;
    if (0 < (atlas->ConfigData).Size) {
      uVar95 = 0;
      local_430 = (ulong)uVar77 << 0x20;
      iVar73 = 0;
      uVar84 = 0;
      do {
        pIVar55 = (atlas->ConfigData).Data;
        psVar97 = (stbtt_fontinfo *)(local_418 + uVar95 * 0xc);
        pIVar87 = pIVar55[uVar95].GlyphRanges;
        IVar82 = *pIVar87;
        if (IVar82 == 0) {
          *(void **)&psVar97[1].fontstart = (void *)((long)local_368 + (uVar84 & 0xffffffff) * 0x28)
          ;
          psVar97[1].loca = 0;
          local_3f0 = 0;
          uVar72 = uVar84;
        }
        else {
          uVar75 = 0;
          local_3f0 = 0;
          do {
            if (pIVar87[uVar75 * 2 + 1] == 0) {
              *(void **)&psVar97[1].fontstart =
                   (void *)((long)local_368 + (uVar84 & 0xffffffff) * 0x28);
              psVar97[1].loca = (int)uVar75;
              uVar72 = (uVar84 & 0xffffffff) + uVar75;
              if ((int)uVar75 == 0) goto LAB_0017c9d7;
              goto LAB_0017c96d;
            }
            local_3f0 = (ulong)(((int)local_3f0 - (uint)IVar82) + (uint)pIVar87[uVar75 * 2 + 1] + 1)
            ;
            IVar82 = pIVar87[uVar75 * 2 + 2];
            uVar75 = uVar75 + 1;
          } while (IVar82 != 0);
          *(void **)&psVar97[1].fontstart = (void *)((long)local_368 + (uVar84 & 0xffffffff) * 0x28)
          ;
          psVar97[1].loca = (int)uVar75;
          uVar72 = (ulong)(uint)((int)uVar84 + (int)uVar75);
LAB_0017c96d:
          fVar109 = pIVar55[uVar95].SizePixels;
          pfVar63 = (float *)((long)local_368 + (uVar84 & 0xffffffff) * 0x28);
          uVar84 = 0;
          iVar94 = (int)local_430;
          do {
            *pfVar63 = fVar109;
            uVar46 = pIVar87[uVar84 * 2];
            pfVar63[1] = (float)(uint)uVar46;
            iVar91 = (uint)pIVar87[uVar84 * 2 + 1] - (uint)uVar46;
            pfVar63[4] = (float)(iVar91 + 1);
            *(void **)(pfVar63 + 6) = (void *)((long)iVar94 * 0x1c + (long)local_328);
            iVar94 = iVar91 + iVar94 + 1;
            uVar84 = uVar84 + 1;
            pfVar63 = pfVar63 + 10;
          } while ((uVar75 & 0xffffffff) != uVar84);
          local_430 = CONCAT44(local_430._4_4_,iVar94);
        }
LAB_0017c9d7:
        local_450 = &psVar97[1].loca;
        local_4a0 = &psVar97[1].fontstart;
        local_3d8 = (float *)CONCAT44(local_3d8._4_4_,iVar73);
        psVar97[1].userdata = (void *)((long)iVar73 * 0x10 + (long)local_320);
        *(int *)&psVar97[1].data = (int)local_3f0;
        local_3b8 = uVar95;
        stbtt_PackSetOversampling
                  (&local_3b0,pIVar55[uVar95].OversampleH,pIVar55[uVar95].OversampleV);
        uVar145 = local_3b0._32_8_;
        local_448 = (long)psVar97[1].loca;
        if (local_448 < 1) {
          iVar73 = 0;
        }
        else {
          psVar60 = *(stbtt__point **)&psVar97[1].fontstart;
          local_3d0 = (stbtt__point *)
                      CONCAT44(local_3d0._4_4_,(float)(local_3b0._32_8_ & 0xffffffff));
          local_47c = (float)((ulong)local_3b0._32_8_ >> 0x20);
          local_338._0_8_ = (ulong)local_3b0._32_8_ >> 0x20;
          sVar83 = (short)local_3b0.v_oversample;
          sVar47 = (short)local_3b0.padding;
          local_350 = (long)psVar97[1].userdata + 6;
          lVar53 = 0;
          iVar73 = 0;
          local_408 = psVar60;
          do {
            fVar109 = psVar60[lVar53 * 5].x;
            auVar148 = ZEXT416((uint)fVar109);
            if (fVar109 <= 0.0) {
              auVar148._0_4_ = -fVar109;
              auVar148._4_4_ = 0x80000000;
              auVar148._8_4_ = 0x80000000;
              auVar148._12_4_ = 0x80000000;
              uVar86 = (uint)(ushort)(*(ushort *)(psVar97->data + (long)psVar97->head + 0x12) << 8 |
                                     *(ushort *)(psVar97->data + (long)psVar97->head + 0x12) >> 8);
            }
            else {
              puVar59 = psVar97->data;
              lVar74 = (long)psVar97->hhea;
              uVar86 = ((int)(short)((ushort)puVar59[lVar74 + 4] << 8) | (uint)puVar59[lVar74 + 5])
                       - ((int)(short)((ushort)puVar59[lVar74 + 6] << 8) | (uint)puVar59[lVar74 + 7]
                         );
            }
            auVar110._4_12_ = auVar148._4_12_;
            fVar109 = auVar148._0_4_ / (float)(int)uVar86;
            *(char *)&psVar60[lVar53 * 5 + 4].x = (char)uVar145;
            *(char *)((long)&psVar60[lVar53 * 5 + 4].x + 1) = local_338[0];
            if (0 < (int)psVar60[lVar53 * 5 + 2].x) {
              local_428._0_4_ = iVar73;
              local_478._0_4_ = fVar109 * local_3d0._0_4_;
              auVar110._0_4_ = fVar109 * local_47c;
              psVar79 = (short *)((long)iVar73 * 0x10 + local_350);
              lVar74 = 0;
              _local_468 = auVar110;
              do {
                iVar73 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar97->data,psVar97->index_map);
                stbtt_GetGlyphBitmapBoxSubpixel
                          (psVar97,iVar73,(float)local_478._0_4_,local_468._0_4_,auVar111._0_4_,
                           in_XMM3._0_4_,(int *)local_238,(int *)&local_3e8,(int *)&local_400,
                           (int *)&local_480);
                psVar79[-1] = (((short)(stbtt_uint32)local_400 + (short)uVar145) -
                              (short)local_238._0_8_) + sVar47 + -1;
                *psVar79 = ~(ushort)local_3e8.data + (short)local_480 + sVar83 + sVar47;
                lVar74 = lVar74 + 1;
                psVar79 = psVar79 + 8;
              } while (lVar74 < (int)psVar60[lVar53 * 5 + 2].x);
              iVar73 = local_428._0_4_ + (int)lVar74;
              psVar60 = local_408;
            }
            lVar53 = lVar53 + 1;
          } while (lVar53 != local_448);
        }
        if ((float)iVar73 != (float)local_3f0) {
          __assert_fail("n == font_glyphs_count",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                        ,0x704,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        iVar73 = *local_450;
        if (0 < iVar73) {
          lVar53._0_4_ = psVar97[1].fontstart;
          lVar53._4_4_ = psVar97[1].numGlyphs;
          lVar74 = 0;
          iVar94 = 0;
          do {
            if (0 < *(int *)(lVar53 + 0x10 + lVar74 * 0x28)) {
              uVar84 = (long)iVar94 << 4 | 6;
              iVar73 = 0;
              do {
                iVar91 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar97->data,psVar97->index_map);
                if (iVar91 == 0) {
                  *(undefined4 *)((long)psVar97[1].userdata + (uVar84 - 2)) = 0;
                }
                iVar73 = iVar73 + 1;
                lVar53 = *(long *)local_4a0;
                uVar84 = uVar84 + 0x10;
              } while (iVar73 < *(int *)(lVar53 + 0x10 + lVar74 * 0x28));
              iVar94 = iVar94 + iVar73;
              iVar73 = *local_450;
            }
            lVar74 = lVar74 + 1;
          } while (lVar74 < iVar73);
        }
        ptr = (stbrp_context *)local_3b0.pack_info;
        iVar73 = (int)local_3f0;
        stbrp_pack_rects((stbrp_context *)local_3b0.pack_info,(stbrp_rect *)psVar97[1].userdata,
                         iVar73);
        if (0 < iVar73) {
          pvVar57 = psVar97[1].userdata;
          lVar53 = 0;
          do {
            if ((*(short *)((long)pvVar57 + lVar53 + 4) == 0) &&
               (*(short *)((long)pvVar57 + lVar53 + 6) == 0)) {
              *(undefined4 *)((long)pvVar57 + lVar53 + 0xc) = 0;
            }
            if (*(int *)((long)pvVar57 + lVar53 + 0xc) != 0) {
              iVar73 = (uint)*(ushort *)((long)pvVar57 + lVar53 + 6) +
                       (uint)*(ushort *)((long)pvVar57 + lVar53 + 10);
              if (iVar73 < atlas->TexHeight) {
                iVar73 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar73;
            }
            lVar53 = lVar53 + 0x10;
          } while ((local_3f0 & 0xffffffff) << 4 != lVar53);
        }
        iVar73 = (int)local_3f0 + (int)local_3d8;
        uVar95 = local_3b8 + 1;
        uVar84 = uVar72;
      } while ((long)uVar95 < (long)(atlas->ConfigData).Size);
    }
    if (iVar73 != (int)local_438) {
      __assert_fail("buf_rects_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71b,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((int)local_430 != (int)local_438) {
      __assert_fail("buf_packedchars_n == total_glyphs_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71c,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    if ((float)uVar72 != local_378) {
      __assert_fail("buf_ranges_n == total_ranges_count",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                    ,0x71d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
    }
    uVar86 = atlas->TexHeight;
    if ((atlas->Flags & 1) == 0) {
      uVar86 = (int)(uVar86 - 1) >> 1 | uVar86 - 1;
      uVar86 = (int)uVar86 >> 2 | uVar86;
      uVar86 = (int)uVar86 >> 4 | uVar86;
      uVar86 = (int)uVar86 >> 8 | uVar86;
      uVar86 = (int)uVar86 >> 0x10 | uVar86;
    }
    iVar73 = uVar86 + 1;
    atlas->TexHeight = iVar73;
    auVar111._0_4_ = (float)atlas->TexWidth;
    auVar111._4_4_ = (float)iVar73;
    auVar111._8_8_ = 0;
    auVar111 = divps(_DAT_001aaa80,auVar111);
    atlas->TexUvScale = auVar111._0_8_;
    puVar59 = (uchar *)ImGui::MemAlloc((long)(iVar73 * atlas->TexWidth));
    atlas->TexPixelsAlpha8 = puVar59;
    memset(puVar59,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
    local_3b0.pixels = atlas->TexPixelsAlpha8;
    local_3b0.height = atlas->TexHeight;
    if (0 < (atlas->ConfigData).Size) {
      lVar53 = 0;
      do {
        psVar54 = local_418;
        local_2f0 = (atlas->ConfigData).Data;
        local_2f8 = lVar53 * 0x80;
        local_410 = (stbtt_fontinfo *)(local_418 + lVar53 * 0xc);
        local_2e8 = lVar53;
        stbtt_PackSetOversampling
                  (&local_3b0,local_2f0[lVar53].OversampleH,local_2f0[lVar53].OversampleV);
        local_288._0_4_ = local_3b0.h_oversample;
        local_288._4_4_ = local_3b0.v_oversample;
        uStack_280 = 0;
        local_2d0 = (long)*(int *)&psVar54[lVar53 * 0xc + 0xb].next;
        if (0 < (long)*(int *)&psVar54[lVar53 * 0xc + 0xb].next) {
          psVar54 = local_418 + lVar53 * 0xc + 10;
          lVar74._0_2_ = psVar54->x;
          lVar74._2_2_ = psVar54->y;
          lVar74._4_4_ = *(undefined4 *)&psVar54->field_0x4;
          psVar54 = local_418 + lVar53 * 0xc + 0xb;
          lVar61._0_2_ = psVar54->x;
          lVar61._2_2_ = psVar54->y;
          lVar61._4_4_ = *(undefined4 *)&psVar54->field_0x4;
          lVar93 = 0;
          lVar53 = 0;
          local_310 = lVar74;
          local_2d8 = lVar61;
          do {
            uStack_36c = 0x80000000;
            uStack_370 = 0x80000000;
            uStack_374 = 0x80000000;
            fVar109 = *(float *)(lVar61 + lVar93 * 0x28);
            if (fVar109 <= 0.0) {
              fVar109 = -fVar109;
              uVar86 = (uint)(ushort)(*(ushort *)(local_410->data + (long)local_410->head + 0x12) <<
                                      8 | *(ushort *)
                                           (local_410->data + (long)local_410->head + 0x12) >> 8);
            }
            else {
              puVar59 = local_410->data;
              lVar74 = (long)local_410->hhea;
              uVar86 = ((int)(short)((ushort)puVar59[lVar74 + 4] << 8) | (uint)puVar59[lVar74 + 5])
                       - ((int)(short)((ushort)puVar59[lVar74 + 6] << 8) | (uint)puVar59[lVar74 + 7]
                         );
              uStack_374 = 0;
              uStack_370 = 0;
              uStack_36c = 0;
              lVar74 = local_310;
            }
            local_378 = fVar109 / (float)(int)uVar86;
            lVar98 = lVar61 + lVar93 * 0x28;
            uVar72 = *(ulong *)(lVar98 + 0x20);
            auVar37._8_6_ = 0;
            auVar37._0_8_ = uVar72;
            auVar37[0xe] = (char)(uVar72 >> 0x38);
            auVar40._8_4_ = 0;
            auVar40._0_8_ = uVar72;
            auVar40[0xc] = (char)(uVar72 >> 0x30);
            auVar40._13_2_ = auVar37._13_2_;
            auVar41._8_4_ = 0;
            auVar41._0_8_ = uVar72;
            auVar41._12_3_ = auVar40._12_3_;
            auVar42._8_2_ = 0;
            auVar42._0_8_ = uVar72;
            auVar42[10] = (char)(uVar72 >> 0x28);
            auVar42._11_4_ = auVar41._11_4_;
            auVar43._8_2_ = 0;
            auVar43._0_8_ = uVar72;
            auVar43._10_5_ = auVar42._10_5_;
            auVar44[8] = (char)(uVar72 >> 0x20);
            auVar44._0_8_ = uVar72;
            auVar44._9_6_ = auVar43._9_6_;
            cVar108 = (char)(uVar72 >> 0x18);
            Var28 = CONCAT91((unkuint9)auVar44._8_7_ << 8,cVar108);
            auVar34[10] = 0;
            auVar34._0_10_ = Var28;
            cVar107 = (char)(uVar72 >> 0x10);
            auVar27._1_11_ = auVar34 << 8;
            auVar27[0] = cVar107;
            auVar33[0xc] = 0;
            auVar33._0_12_ = auVar27;
            cVar106 = (char)(uVar72 >> 8);
            auVar26._1_13_ = auVar33 << 8;
            auVar26[0] = cVar106;
            bVar102 = (byte)uVar72;
            auVar105._0_2_ = CONCAT11(0,bVar102);
            auVar105._2_14_ = auVar26;
            uVar116 = (ushort)Var28;
            auVar38._10_2_ = 0;
            auVar38._0_10_ = auVar105._0_10_;
            auVar38._12_2_ = uVar116;
            uVar45 = CONCAT42(auVar38._10_4_,auVar27._0_2_);
            uVar46 = auVar26._0_2_;
            auVar29._2_10_ = (unkuint10)uVar45 << 0x10;
            auVar29._0_2_ = uVar46;
            auVar112._0_4_ = CONCAT22(0,auVar105._0_2_);
            auVar112._4_12_ = auVar29;
            local_3b0._32_8_ = auVar112._0_8_;
            iVar73 = *(int *)(lVar98 + 0x10);
            if (0 < iVar73) {
              local_2c8 = lVar93;
              auVar113._0_4_ = (float)auVar112._0_4_;
              auVar113._4_4_ = (float)auVar29._0_4_;
              auVar113._8_4_ = (float)(int)uVar45;
              auVar113._12_4_ = (float)uVar116;
              auVar123 = (undefined1  [16])0x0;
              local_258 = divps(_DAT_001aaa80,auVar113);
              auVar125[0] = -(bVar102 == 0);
              auVar125[1] = -(bVar102 == 0);
              auVar125[2] = -(bVar102 == 0);
              auVar125[3] = -(bVar102 == 0);
              auVar125[4] = -(cVar106 == '\0');
              auVar125[5] = -(cVar106 == '\0');
              auVar125[6] = -(cVar106 == '\0');
              auVar125[7] = -(cVar106 == '\0');
              auVar125[8] = -(cVar107 == '\0');
              auVar125[9] = -(cVar107 == '\0');
              auVar125[10] = -(cVar107 == '\0');
              auVar125[0xb] = -(cVar107 == '\0');
              auVar125[0xc] = -(cVar108 == '\0');
              auVar125[0xd] = -(cVar108 == '\0');
              auVar125[0xe] = -(cVar108 == '\0');
              auVar125[0xf] = -(cVar108 == '\0');
              sVar83 = -auVar27._0_2_;
              sVar47 = -uVar116;
              Var32 = CONCAT64(CONCAT42(CONCAT22(sVar47,sVar47),sVar83),CONCAT22(sVar83,sVar47));
              auVar30._4_8_ = (long)((unkuint10)Var32 >> 0x10);
              auVar30._2_2_ = 1 - uVar46;
              auVar30._0_2_ = 1 - uVar46;
              auVar118._0_4_ = (float)(int)(short)(1 - auVar105._0_2_);
              auVar118._4_4_ = (float)(auVar30._0_4_ >> 0x10);
              auVar118._8_4_ = (float)((int)((unkuint10)Var32 >> 0x10) >> 0x10);
              auVar118._12_4_ = (float)(int)sVar47;
              auVar114._0_4_ = auVar113._0_4_ + auVar113._0_4_;
              auVar114._4_4_ = auVar113._4_4_ + auVar113._4_4_;
              auVar114._8_4_ = auVar113._8_4_ + auVar113._8_4_;
              auVar114._12_4_ = auVar113._12_4_ + auVar113._12_4_;
              auVar111 = divps(auVar118,auVar114);
              local_248 = ~auVar125 & auVar111;
              uVar95 = (ulong)auVar105._0_2_;
              lVar53 = (long)(int)lVar53;
              uVar84 = (ulong)uVar46;
              local_268._4_4_ = local_258._4_4_;
              local_268._0_4_ = local_268._4_4_;
              local_268._8_4_ = local_268._4_4_;
              local_268._12_4_ = local_268._4_4_;
              local_278._4_4_ = SUB164(~auVar125 & auVar111,4);
              local_278._0_4_ = local_278._4_4_;
              local_278._8_4_ = local_278._4_4_;
              local_278._12_4_ = local_278._4_4_;
              uVar72 = 0;
              local_358 = lVar98;
              do {
                psVar97 = local_410;
                if (*(int *)(lVar74 + 0xc + lVar53 * 0x10) != 0) {
                  lVar74 = lVar53 * 0x10 + lVar74;
                  local_2a0 = (short *)(uVar72 * 0x1c + *(long *)(lVar98 + 0x18));
                  local_438 = uVar72;
                  local_298 = lVar53;
                  iVar94 = stbtt_FindGlyphIndex
                                     ((stbtt_fontinfo *)local_410->data,local_410->index_map);
                  uVar145 = *(undefined8 *)(lVar74 + 4);
                  auVar111 = pshuflw(ZEXT416((uint)local_3b0.padding),
                                     ZEXT416((uint)local_3b0.padding),0);
                  *(ulong *)(lVar74 + 4) =
                       CONCAT44(CONCAT22((short)((ulong)uVar145 >> 0x30) + auVar111._6_2_,
                                         (short)((ulong)uVar145 >> 0x20) + auVar111._4_2_),
                                CONCAT22((short)((ulong)uVar145 >> 0x10) - auVar111._2_2_,
                                         (short)uVar145 - auVar111._0_2_));
                  puVar59 = psVar97->data;
                  uVar46 = *(ushort *)(puVar59 + (long)psVar97->hhea + 0x22) << 8 |
                           *(ushort *)(puVar59 + (long)psVar97->hhea + 0x22) >> 8;
                  iVar73 = psVar97->hmtx;
                  lVar53 = (ulong)uVar46 * 4 + (long)iVar73 + -4;
                  lVar61 = (ulong)uVar46 * 4 + (long)iVar73 + -3;
                  if (iVar94 < (int)(uint)uVar46) {
                    lVar53 = (long)(iVar94 * 4) + (long)iVar73;
                    lVar61 = (long)(iVar94 * 4) + 1 + (long)iVar73;
                  }
                  local_344 = (uint)puVar59[lVar61];
                  local_340 = (uint)puVar59[lVar53];
                  _local_468 = ZEXT416((uint)((float)uVar95 * local_378));
                  local_478 = ZEXT416((uint)((float)uVar84 * local_378));
                  fVar109 = local_378;
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar97,iVar94,(float)uVar95 * local_378,(float)uVar84 * local_378,
                             local_378,auVar123._0_4_,(int *)&local_440,&local_33c,&local_28c,
                             &local_290);
                  local_300 = local_3b0.pixels + *(ushort *)(lVar74 + 8);
                  uVar46 = *(ushort *)(lVar74 + 10);
                  local_308 = (long)local_3b0.stride_in_bytes;
                  uVar77 = (uint)*(ushort *)(lVar74 + 4) - (int)uVar95;
                  uVar116 = *(ushort *)(lVar74 + 6);
                  local_430 = lVar74;
                  uVar86 = stbtt_GetGlyphShape(psVar97,iVar94,(stbtt_vertex **)&local_400);
                  stbtt_GetGlyphBitmapBoxSubpixel
                            (psVar97,iVar94,(float)local_468._0_4_,(float)local_478._0_4_,fVar109,
                             auVar123._0_4_,(int *)&local_480,(int *)&local_43c,(int *)0x0,
                             (int *)0x0);
                  sVar52 = local_480;
                  local_450 = (int *)CONCAT44(local_450._4_4_,uVar77 + 1);
                  if (uVar77 + 1 != 0) {
                    uVar99 = (uint)uVar116 - (int)uVar84;
                    if (uVar99 + 1 != 0) {
                      local_428._0_4_ = uVar99 + 1;
                      local_3c4 = uVar99;
                      if (0 < (int)uVar86) {
                        local_300 = local_300 + (ulong)uVar46 * local_308;
                        lVar53 = CONCAT44(local_400._4_4_,(stbtt_uint32)local_400);
                        local_3f4 = local_43c;
                        fVar109 = (float)local_478._0_4_;
                        if ((float)local_468._0_4_ <= (float)local_478._0_4_) {
                          fVar109 = (float)local_468._0_4_;
                        }
                        fVar109 = (0.35 / fVar109) * (0.35 / fVar109);
                        lVar74 = 0;
                        uVar99 = 0;
                        do {
                          uVar99 = uVar99 + (*(char *)(lVar53 + 0xc + lVar74) == '\x01');
                          lVar74 = lVar74 + 0xe;
                        } while ((ulong)uVar86 * 0xe != lVar74);
                        if (uVar99 != 0) {
                          uVar72 = (ulong)uVar99;
                          psVar60 = (stbtt__point *)ImGui::MemAlloc(uVar72 * 4);
                          if (psVar60 != (stbtt__point *)0x0) {
                            bVar69 = false;
                            fVar132 = 0.0;
                            points = (stbtt__point *)0x0;
                            fVar127 = 0.0;
                            local_3d0 = psVar60;
                            bVar101 = true;
                            do {
                              bVar80 = bVar101;
                              psVar60 = local_3d0;
                              if ((bVar69) &&
                                 (points = (stbtt__point *)ImGui::MemAlloc((long)(int)fVar127 << 3),
                                 points == (stbtt__point *)0x0)) {
                                ImGui::MemFree((void *)0x0);
                                goto LAB_0017e08f;
                              }
                              local_238._0_8_ = local_238._0_8_ & 0xffffffff00000000;
                              fVar127 = 0.0;
                              fVar103 = 0.0;
                              uVar84 = 0xffffffff;
                              lVar74 = 0;
                              local_408 = points;
                              do {
                                uVar143 = local_238._0_4_;
                                switch(*(undefined1 *)(lVar53 + 0xc + lVar74)) {
                                case 1:
                                  if (-1 < (int)uVar84) {
                                    (&local_3d0->x)[uVar84] =
                                         (float)(local_238._0_4_ - (int)fVar132);
                                  }
                                  uVar84 = (ulong)((int)uVar84 + 1);
                                  auVar111 = pshuflw(ZEXT416(*(uint *)(lVar53 + lVar74)),
                                                     ZEXT416(*(uint *)(lVar53 + lVar74)),0x60);
                                  fVar127 = (float)(auVar111._0_4_ >> 0x10);
                                  fVar103 = (float)(auVar111._4_4_ >> 0x10);
                                  local_238._0_4_ = local_238._0_4_ + 1;
                                  fVar132 = (float)uVar143;
                                  if (points != (stbtt__point *)0x0) {
                                    points[(int)uVar143].x = fVar127;
                                    points[(int)uVar143].y = fVar103;
                                  }
                                  break;
                                case 2:
                                  lVar61 = (long)(int)local_238._0_4_;
                                  auVar111 = pshuflw(ZEXT416(*(uint *)(lVar53 + lVar74)),
                                                     ZEXT416(*(uint *)(lVar53 + lVar74)),0x60);
                                  fVar127 = (float)(auVar111._0_4_ >> 0x10);
                                  fVar103 = (float)(auVar111._4_4_ >> 0x10);
                                  local_238._0_4_ = local_238._0_4_ + 1;
                                  if (points != (stbtt__point *)0x0) {
                                    points[lVar61].x = fVar127;
                                    points[lVar61].y = fVar103;
                                  }
                                  break;
                                case 3:
                                  fVar117 = (float)(int)*(short *)(lVar53 + 6 + lVar74);
                                  auVar123 = ZEXT416((uint)fVar117);
                                  stbtt__tesselate_curve
                                            (points,(int *)local_238,fVar127,fVar103,
                                             (float)(int)*(short *)(lVar53 + 4 + lVar74),fVar117,
                                             (float)(int)*(short *)(lVar53 + lVar74),
                                             (float)(int)*(short *)(lVar53 + 2 + lVar74),fVar109,0);
                                  goto LAB_0017d47c;
                                case 4:
                                  fVar117 = (float)(int)*(short *)(lVar53 + 6 + lVar74);
                                  auVar123 = ZEXT416((uint)fVar117);
                                  stbtt__tesselate_cubic
                                            (points,(int *)local_238,fVar127,fVar103,
                                             (float)(int)*(short *)(lVar53 + 4 + lVar74),fVar117,
                                             (float)(int)*(short *)(lVar53 + 8 + lVar74),
                                             (float)(int)*(short *)(lVar53 + 10 + lVar74),
                                             (float)(int)*(short *)(lVar53 + lVar74),
                                             (float)(int)*(short *)(lVar53 + 2 + lVar74),fVar109,0);
LAB_0017d47c:
                                  auVar111 = pshuflw(ZEXT416(*(uint *)(lVar53 + lVar74)),
                                                     ZEXT416(*(uint *)(lVar53 + lVar74)),0x60);
                                  fVar127 = (float)(auVar111._0_4_ >> 0x10);
                                  fVar103 = (float)(auVar111._4_4_ >> 0x10);
                                  points = local_408;
                                }
                                psVar60 = local_3d0;
                                lVar74 = lVar74 + 0xe;
                              } while ((ulong)uVar86 * 0xe != lVar74);
                              (&local_3d0->x)[(int)uVar84] = (float)(local_238._0_4_ - (int)fVar132)
                              ;
                              bVar69 = true;
                              fVar127 = (float)local_238._0_4_;
                              bVar101 = false;
                            } while (bVar80);
                            if (points != (stbtt__point *)0x0) {
                              uVar84 = 0;
                              lVar53 = 0;
                              do {
                                lVar53 = (long)(int)lVar53 + (long)(int)(&local_3d0->x)[uVar84];
                                uVar84 = uVar84 + 1;
                              } while (uVar72 != uVar84);
                              psVar62 = (stbtt__edge *)ImGui::MemAlloc(lVar53 * 0x14 + 0x14);
                              if (psVar62 != (stbtt__edge *)0x0) {
                                auVar123._0_8_ =
                                     CONCAT44(local_478._0_4_,local_468._0_4_) ^ 0x8000000000000000;
                                auVar123._8_8_ = auVar123._0_8_;
                                uVar84 = 0;
                                uVar86 = 0;
                                iVar73 = 0;
                                do {
                                  fVar109 = (&psVar60->x)[uVar84];
                                  if (0 < (int)fVar109) {
                                    uVar75 = (ulong)((int)fVar109 - 1);
                                    uVar95 = 0;
                                    fVar127 = fVar109;
                                    do {
                                      iVar94 = (int)uVar75;
                                      fVar132 = local_408[(long)iVar73 + (long)iVar94].y;
                                      fVar103 = local_408[(long)iVar73 + uVar95].y;
                                      if ((fVar132 != fVar103) || (NAN(fVar132) || NAN(fVar103))) {
                                        iVar91 = (int)uVar95;
                                        if (fVar132 <= fVar103) {
                                          iVar91 = iVar94;
                                          iVar94 = (int)uVar95;
                                        }
                                        psVar62[(int)uVar86].invert = (uint)(fVar103 < fVar132);
                                        sVar2 = local_408[(long)iVar73 + (long)iVar94];
                                        sVar3 = local_408[(long)iVar73 + (long)iVar91];
                                        psVar85 = psVar62 + (int)uVar86;
                                        psVar85->x0 = sVar2.x * (float)local_468._0_4_ + 0.0;
                                        psVar85->y0 = sVar2.y * -(float)local_478._0_4_ + 0.0;
                                        psVar85->x1 = sVar3.x * (float)local_468._0_4_ + 0.0;
                                        psVar85->y1 = sVar3.y * -(float)local_478._0_4_ + 0.0;
                                        uVar86 = uVar86 + 1;
                                        fVar127 = (&psVar60->x)[uVar84];
                                      }
                                      uVar75 = uVar95 & 0xffffffff;
                                      uVar95 = uVar95 + 1;
                                    } while ((long)uVar95 < (long)(int)fVar127);
                                  }
                                  iVar73 = iVar73 + (int)fVar109;
                                  uVar84 = uVar84 + 1;
                                } while (uVar84 != uVar72);
                                stbtt__sort_edges_quicksort(psVar62,uVar86);
                                if (1 < (int)uVar86) {
                                  uVar72 = 1;
                                  lVar53 = 2;
                                  psVar85 = psVar62;
                                  do {
                                    uVar1 = psVar62[uVar72].x0;
                                    uVar4 = psVar62[uVar72].y0;
                                    iVar73 = psVar62[uVar72].invert;
                                    stack0xfffffffffffffdd0 =
                                         (stbrp_node *)CONCAT44(iStack_22c,iVar73);
                                    local_238._0_8_ = *(undefined8 *)&psVar62[uVar72].x1;
                                    lVar74 = lVar53;
                                    psVar90 = psVar85;
                                    do {
                                      if (psVar90->y0 <= (float)uVar4) {
                                        uVar99 = (int)lVar74 - 1;
                                        goto LAB_0017d69d;
                                      }
                                      psVar90[1].invert = psVar90->invert;
                                      fVar109 = psVar90->y0;
                                      fVar127 = psVar90->x1;
                                      fVar132 = psVar90->y1;
                                      psVar90[1].x0 = psVar90->x0;
                                      psVar90[1].y0 = fVar109;
                                      psVar90[1].x1 = fVar127;
                                      psVar90[1].y1 = fVar132;
                                      lVar74 = lVar74 + -1;
                                      psVar90 = psVar90 + -1;
                                    } while (1 < lVar74);
                                    uVar99 = 0;
LAB_0017d69d:
                                    if (uVar72 != uVar99) {
                                      psVar62[(int)uVar99].x0 = (float)uVar1;
                                      psVar62[(int)uVar99].y0 = (float)uVar4;
                                      *(undefined8 *)&psVar62[(int)uVar99].x1 = local_238._0_8_;
                                      psVar62[(int)uVar99].invert = iVar73;
                                    }
                                    uVar72 = uVar72 + 1;
                                    lVar53 = lVar53 + 1;
                                    psVar85 = psVar85 + 1;
                                  } while (uVar72 != uVar86);
                                }
                                auVar31._8_8_ = 0;
                                auVar31._0_4_ = local_3e8.cursor;
                                auVar31._4_4_ = local_3e8.size;
                                local_3e8 = (stbtt__buf)(auVar31 << 0x40);
                                pfVar63 = (float *)local_238;
                                if (0x40 < (int)local_450) {
                                  pfVar63 = (float *)ImGui::MemAlloc(((ulong)local_450 & 0xffffffff)
                                                                     * 8 + 4);
                                }
                                psVar62[(int)uVar86].y0 =
                                     (float)(int)(local_428._0_4_ + local_3f4) + 1.0;
                                if (local_3c4 < 0x7fffffff) {
                                  local_2c0 = (long)(int)local_450;
                                  local_3f0 = CONCAT44(local_3f0._4_4_,(float)(int)sVar52);
                                  local_3d8 = pfVar63 + local_2c0;
                                  local_318 = local_3d8 + 1;
                                  local_2b0 = local_2c0 * 4;
                                  local_47c = (float)(int)local_450;
                                  local_2b8 = (long)(int)(uVar77 + 2) << 2;
                                  local_360 = 0;
                                  uVar72 = 0;
                                  local_3c0 = (undefined8 *)0x0;
                                  local_3b8 = local_3b8 & 0xffffffff00000000;
                                  psVar100 = (stbtt__buf *)0x0;
                                  psVar67 = (stbtt__buf *)0x0;
                                  psVar85 = psVar62;
                                  sVar52 = local_3f4;
                                  local_2e0 = psVar62;
                                  do {
                                    local_448 = CONCAT44(local_448._4_4_,(float)(int)sVar52);
                                    fVar109 = (float)(int)sVar52 + 1.0;
                                    local_3f4 = sVar52;
                                    local_2a8 = uVar72;
                                    memset(pfVar63,0,local_2b0);
                                    memset(local_3d8,0,local_2b8);
                                    puVar76 = local_3c0;
                                    if (psVar67 != (stbtt__buf *)0x0) {
                                      psVar64 = &local_3e8;
                                      do {
                                        psVar65 = psVar67;
                                        if ((float)psVar67[1].size <= (float)local_448) {
                                          psVar64->data = psVar67->data;
                                          fVar127 = *(float *)((long)&psVar67[1].data + 4);
                                          if ((fVar127 == 0.0) && (!NAN(fVar127))) {
                                            __assert_fail("z->direction",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xc4f,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                          }
                                          puVar59 = (uchar *)((long)&psVar67[1].data + 4);
                                          puVar59[0] = '\0';
                                          puVar59[1] = '\0';
                                          puVar59[2] = '\0';
                                          puVar59[3] = '\0';
                                          psVar67->data = (uchar *)psVar100;
                                          psVar65 = psVar64;
                                          psVar100 = psVar67;
                                        }
                                        psVar67 = (stbtt__buf *)psVar65->data;
                                        psVar64 = psVar65;
                                      } while (psVar67 != (stbtt__buf *)0x0);
                                    }
                                    fVar127 = psVar85->y0;
                                    fVar132 = (float)local_448;
                                    while (fVar127 <= fVar109) {
                                      fVar103 = psVar85->y1;
                                      puVar66 = puVar76;
                                      if ((fVar127 != fVar103) ||
                                         (psVar67 = psVar100, NAN(fVar127) || NAN(fVar103))) {
                                        if (psVar100 == (stbtt__buf *)0x0) {
                                          if ((int)local_3b8 == 0) {
                                            puVar66 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                            if (puVar66 == (undefined8 *)0x0) {
                                              __assert_fail("z != __null",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xabf,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                            }
                                            *puVar66 = puVar76;
                                            fVar127 = psVar85->y0;
                                            fVar103 = psVar85->y1;
                                            iVar73 = 799;
                                            fVar132 = (float)local_448;
                                          }
                                          else {
                                            iVar73 = (int)local_3b8 + -1;
                                          }
                                          local_3b8 = CONCAT44(local_3b8._4_4_,iVar73);
                                          psVar100 = (stbtt__buf *)(puVar66 + (long)iVar73 * 4 + 1);
                                          psVar67 = (stbtt__buf *)0x0;
                                        }
                                        else {
                                          psVar67 = (stbtt__buf *)psVar100->data;
                                        }
                                        fVar117 = psVar85->x0;
                                        fVar122 = (psVar85->x1 - fVar117) / (fVar103 - fVar127);
                                        psVar100->size = (int)fVar122;
                                        *(uint *)&psVar100[1].data =
                                             -(uint)(fVar122 != 0.0) & (uint)(1.0 / fVar122);
                                        psVar100->cursor =
                                             (int)(((fVar132 - fVar127) * fVar122 + fVar117) -
                                                  (float)local_3f0);
                                        *(undefined4 *)((long)&psVar100[1].data + 4) =
                                             *(undefined4 *)
                                              (&DAT_001b58c0 + (ulong)(psVar85->invert == 0) * 4);
                                        psVar100[1].cursor = (int)fVar127;
                                        psVar100[1].size = (int)fVar103;
                                        psVar100->data = (uchar *)0x0;
                                        if (fVar103 < fVar132) {
                                          __assert_fail("z->ey >= scan_y_top",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xc5c,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                        }
                                        psVar100->data = local_3e8.data;
                                        local_3e8.data = (uchar *)psVar100;
                                      }
                                      psVar62 = psVar85 + 1;
                                      psVar85 = psVar85 + 1;
                                      puVar76 = puVar66;
                                      psVar100 = psVar67;
                                      fVar127 = psVar62->y0;
                                    }
                                    local_3c0 = puVar76;
                                    for (e = (stbtt__active_edge *)local_3e8.data;
                                        psVar62 = local_2e0, e != (stbtt__active_edge *)0x0;
                                        e = e->next) {
                                      fVar127 = e->ey;
                                      if (fVar127 < fVar132) {
                                        __assert_fail("e->ey >= y_top",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xb93,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                      }
                                      fVar103 = e->fx;
                                      auVar136._0_8_ = CONCAT44(0,fVar103);
                                      auVar136._8_8_ = 0;
                                      fVar117 = e->fdx;
                                      if ((fVar117 != 0.0) || (NAN(fVar117))) {
                                        fVar122 = e->sy;
                                        if (fVar109 < fVar122) {
                                          __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xba6,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        fVar157 = fVar117 + fVar103;
                                        fVar134 = (float)(~-(uint)(fVar132 < fVar122) &
                                                          (uint)fVar103 |
                                                         (uint)((fVar122 - fVar132) * fVar117 +
                                                               fVar103) & -(uint)(fVar132 < fVar122)
                                                         );
                                        if ((((fVar134 < 0.0) ||
                                             (fVar141 = (float)(~-(uint)(fVar127 < fVar109) &
                                                                (uint)fVar157 |
                                                               (uint)((fVar127 - fVar132) * fVar117
                                                                     + fVar103) &
                                                               -(uint)(fVar127 < fVar109)),
                                             fVar141 < 0.0)) || (local_47c <= fVar134)) ||
                                           (local_47c <= fVar141)) {
                                          if (uVar77 < 0x7fffffff) {
                                            local_350 = CONCAT44(local_350._4_4_,fVar117);
                                            local_428 = ZEXT416((uint)fVar157);
                                            local_338 = auVar136;
                                            iVar73 = 0;
                                            do {
                                              fVar127 = (float)iVar73;
                                              iVar94 = iVar73 + 1;
                                              fVar103 = (float)iVar94;
                                              fVar122 = local_338._0_4_;
                                              fVar134 = (fVar127 - fVar122) / fVar117 + fVar132;
                                              fVar117 = (fVar103 - fVar122) / fVar117 + fVar132;
                                              local_468._0_4_ = fVar127;
                                              fVar157 = local_428._0_4_;
                                              if ((fVar127 <= fVar122) || (fVar157 <= fVar103)) {
                                                if ((fVar127 <= fVar157) || (fVar122 <= fVar103)) {
                                                  if (((fVar127 <= fVar122) || (fVar157 <= fVar127))
                                                     && ((fVar127 <= fVar157 || (fVar122 <= fVar127)
                                                         ))) {
                                                    if (((fVar122 < fVar103) && (fVar103 < fVar157))
                                                       || ((fVar134 = fVar132, fVar157 < fVar103 &&
                                                           (fVar103 < fVar122)))) {
                                                      local_478._0_4_ = fVar103;
                                                      goto LAB_0017dc36;
                                                    }
                                                    goto LAB_0017dce5;
                                                  }
                                                }
                                                else {
                                                  local_478._0_4_ = fVar103;
                                                  stbtt__handle_clipped_edge
                                                            (pfVar63,iVar73,e,fVar122,fVar132,
                                                             fVar103,fVar117);
                                                  fVar122 = (float)local_478._0_4_;
                                                  fVar127 = (float)local_468._0_4_;
                                                  fVar132 = fVar117;
                                                }
                                                stbtt__handle_clipped_edge
                                                          (pfVar63,iVar73,e,fVar122,fVar132,fVar127,
                                                           fVar134);
                                                fVar122 = (float)local_468._0_4_;
                                              }
                                              else {
                                                local_478._0_4_ = fVar103;
                                                stbtt__handle_clipped_edge
                                                          (pfVar63,iVar73,e,fVar122,fVar132,fVar127,
                                                           fVar134);
                                                fVar122 = (float)local_468._0_4_;
                                                fVar103 = (float)local_478._0_4_;
                                                fVar132 = fVar134;
LAB_0017dc36:
                                                stbtt__handle_clipped_edge
                                                          (pfVar63,iVar73,e,fVar122,fVar132,fVar103,
                                                           fVar117);
                                                fVar122 = (float)local_478._0_4_;
                                                fVar134 = fVar117;
                                              }
LAB_0017dce5:
                                              stbtt__handle_clipped_edge
                                                        (pfVar63,iVar73,e,fVar122,fVar134,
                                                         local_428._0_4_,fVar109);
                                              fVar117 = (float)local_350;
                                              iVar73 = iVar94;
                                              fVar132 = (float)local_448;
                                            } while ((int)local_450 != iVar94);
                                          }
                                        }
                                        else {
                                          if (fVar122 <= fVar132) {
                                            fVar122 = fVar132;
                                          }
                                          uVar86 = (uint)fVar134;
                                          if (fVar109 <= fVar127) {
                                            fVar127 = fVar109;
                                          }
                                          uVar99 = (uint)fVar141;
                                          if (uVar86 == uVar99) {
                                            if (((int)uVar86 < 0) || ((int)local_450 <= (int)uVar86)
                                               ) {
                                              __assert_fail("x >= 0 && x < len",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xbc2,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                            }
                                            uVar72 = (ulong)uVar86;
                                            pfVar63[uVar72] =
                                                 (((fVar141 - (float)(int)uVar86) +
                                                  (fVar134 - (float)(int)uVar86)) * -0.5 + 1.0) *
                                                 e->direction * (fVar127 - fVar122) +
                                                 pfVar63[uVar72];
                                            fVar103 = (fVar127 - fVar122) * e->direction;
                                          }
                                          else {
                                            fVar117 = e->fdy;
                                            uVar71 = uVar86;
                                            fVar142 = fVar134;
                                            if (fVar141 < fVar134) {
                                              fVar103 = fVar132 - fVar122;
                                              fVar122 = (fVar132 - fVar127) + fVar109;
                                              fVar117 = -fVar117;
                                              uVar71 = uVar99;
                                              uVar99 = uVar86;
                                              fVar127 = fVar103 + fVar109;
                                              fVar142 = fVar141;
                                              fVar141 = fVar134;
                                              fVar103 = fVar157;
                                            }
                                            iVar73 = uVar71 + 1;
                                            fVar157 = ((float)iVar73 - fVar103) * fVar117 + fVar132;
                                            fVar103 = e->direction;
                                            fVar134 = (fVar157 - fVar122) * fVar103;
                                            lVar53 = (long)(int)uVar71;
                                            pfVar63[lVar53] =
                                                 (((fVar142 - (float)(int)uVar71) + 1.0) * -0.5 +
                                                 1.0) * fVar134 + pfVar63[lVar53];
                                            if (uVar99 - iVar73 != 0 && iVar73 <= (int)uVar99) {
                                              do {
                                                pfVar63[lVar53 + 1] =
                                                     fVar117 * fVar103 * 0.5 + fVar134 +
                                                     pfVar63[lVar53 + 1];
                                                fVar134 = fVar134 + fVar117 * fVar103;
                                                lVar53 = lVar53 + 1;
                                              } while (uVar99 - 1 != (int)lVar53);
                                            }
                                            if (1.01 < ABS(fVar134)) {
                                              __assert_fail("ImFabs(area) <= 1.01f",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                                  ,0xbe7,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                            }
                                            uVar72 = (ulong)(int)uVar99;
                                            pfVar63[uVar72] =
                                                 (fVar127 -
                                                 (fVar117 * (float)(int)(uVar99 - iVar73) + fVar157)
                                                 ) * (((fVar141 - (float)(int)uVar99) + 0.0) * -0.5
                                                     + 1.0) * fVar103 + fVar134 + pfVar63[uVar72];
                                            fVar103 = (fVar127 - fVar122) * fVar103;
                                          }
                                          local_318[uVar72] = fVar103 + local_318[uVar72];
                                        }
                                      }
                                      else if (fVar103 < local_47c) {
                                        if (0.0 <= fVar103) {
                                          local_338 = auVar136;
                                          stbtt__handle_clipped_edge
                                                    (pfVar63,(int)fVar103,e,fVar103,fVar132,fVar103,
                                                     fVar109);
                                          iVar73 = (int)fVar103 + 1;
                                          auVar119 = local_338;
                                          fVar132 = (float)local_448;
                                        }
                                        else {
                                          iVar73 = 0;
                                          auVar119._8_8_ = 0;
                                          auVar119._0_8_ = auVar136._0_8_;
                                        }
                                        stbtt__handle_clipped_edge
                                                  (local_3d8,iVar73,e,auVar119._0_4_,fVar132,
                                                   auVar119._0_4_,fVar109);
                                        fVar132 = (float)local_448;
                                      }
                                    }
                                    auVar123._0_12_ = ZEXT812(0x3f000000);
                                    auVar123._12_4_ = 0;
                                    if (uVar77 < 0x7fffffff) {
                                      fVar109 = 0.0;
                                      pfVar68 = pfVar63;
                                      uVar72 = local_360;
                                      lVar53 = local_2c0;
                                      do {
                                        fVar109 = fVar109 + pfVar68[local_2c0];
                                        iVar73 = (int)(ABS(*pfVar68 + fVar109) * 255.0 + 0.5);
                                        uVar81 = (uchar)iVar73;
                                        if (0xfe < iVar73) {
                                          uVar81 = 0xff;
                                        }
                                        local_300[(int)uVar72] = uVar81;
                                        uVar72 = (ulong)((int)uVar72 + 1);
                                        pfVar68 = pfVar68 + 1;
                                        lVar53 = lVar53 + -1;
                                      } while (lVar53 != 0);
                                    }
                                    for (psVar67 = (stbtt__buf *)local_3e8.data;
                                        psVar67 != (stbtt__buf *)0x0;
                                        psVar67 = (stbtt__buf *)psVar67->data) {
                                      psVar67->cursor =
                                           (int)((float)psVar67->size + (float)psVar67->cursor);
                                    }
                                    sVar52 = local_3f4 + 1;
                                    uVar72 = (ulong)((uint)local_2a8 + 1);
                                    local_360 = (ulong)(uint)((int)local_360 + (int)local_308);
                                    psVar67 = (stbtt__buf *)local_3e8.data;
                                    puVar76 = local_3c0;
                                  } while ((uint)local_2a8 != local_3c4);
                                  while (puVar76 != (undefined8 *)0x0) {
                                    puVar66 = (undefined8 *)*puVar76;
                                    ImGui::MemFree(puVar76);
                                    puVar76 = puVar66;
                                  }
                                }
                                if (pfVar63 != (float *)local_238) {
                                  ImGui::MemFree(pfVar63);
                                }
                                ImGui::MemFree(psVar62);
                                psVar60 = local_3d0;
                              }
                              ImGui::MemFree(psVar60);
                              psVar60 = local_408;
LAB_0017e08f:
                              ImGui::MemFree(psVar60);
                            }
                          }
                        }
                      }
                    }
                  }
                  ImGui::MemFree((void *)CONCAT44(local_400._4_4_,(stbtt_uint32)local_400));
                  auVar111 = _local_468;
                  uVar86 = local_3b0.h_oversample;
                  uVar95 = local_3b0._32_8_ & 0xffffffff;
                  uVar72 = (ulong)*(ushort *)(local_430 + 8);
                  uVar46 = *(ushort *)(local_430 + 10);
                  uVar77 = (uint)*(ushort *)(local_430 + 4);
                  uVar116 = *(ushort *)(local_430 + 6);
                  if (1 < uVar95) {
                    lVar53 = (long)local_3b0.stride_in_bytes;
                    local_238._0_8_ = (uchar *)0x0;
                    iVar73 = 0;
                    if (uVar116 == 0) {
                      uVar116 = 0;
                    }
                    else {
                      uVar99 = (uint)*(ushort *)(local_430 + 4);
                      local_468._2_2_ = 0;
                      local_468._0_2_ = uVar116;
                      stack0xfffffffffffffb9c = auVar111._4_12_;
                      puVar59 = local_3b0.pixels +
                                (ulong)uVar46 * lVar53 + (ulong)*(ushort *)(local_430 + 8);
                      iVar94 = uVar99 - local_3b0.h_oversample;
                      uVar77 = iVar94 + 1;
                      uVar72 = (ulong)uVar77;
                      do {
                        memset(local_238,0,uVar95);
                        uVar71 = uVar77;
                        switch(uVar86) {
                        case 2:
                          if (iVar94 < 0) {
LAB_0017e2c3:
                            uVar70 = 0;
                            uVar71 = 0;
                          }
                          else {
                            uVar84 = 0;
                            uVar70 = 0;
                            do {
                              bVar102 = puVar59[uVar84];
                              bVar6 = local_238[(uint)uVar84 & 7];
                              local_238[(uint)uVar84 + 2 & 7] = bVar102;
                              uVar70 = uVar70 + ((uint)bVar102 - (uint)bVar6);
                              puVar59[uVar84] = (uchar)(uVar70 >> 1);
                              uVar84 = uVar84 + 1;
                            } while (uVar72 != uVar84);
                          }
                          break;
                        case 3:
                          if (iVar94 < 0) goto LAB_0017e2c3;
                          uVar84 = 0;
                          uVar70 = 0;
                          do {
                            bVar102 = puVar59[uVar84];
                            bVar6 = local_238[(uint)uVar84 & 7];
                            local_238[(uint)uVar84 + 3 & 7] = bVar102;
                            uVar70 = uVar70 + ((uint)bVar102 - (uint)bVar6);
                            puVar59[uVar84] = (uchar)(uVar70 / 3);
                            uVar84 = uVar84 + 1;
                          } while (uVar72 != uVar84);
                          break;
                        case 4:
                          if (iVar94 < 0) goto LAB_0017e2c3;
                          uVar84 = 0;
                          uVar70 = 0;
                          do {
                            bVar102 = puVar59[uVar84];
                            uVar75 = (ulong)((uint)uVar84 & 7);
                            local_238[uVar75 ^ 4] = bVar102;
                            uVar70 = uVar70 + ((uint)bVar102 - (uint)(byte)local_238[uVar75]);
                            puVar59[uVar84] = (uchar)(uVar70 >> 2);
                            uVar84 = uVar84 + 1;
                          } while (uVar72 != uVar84);
                          break;
                        case 5:
                          if (iVar94 < 0) goto LAB_0017e2c3;
                          uVar84 = 0;
                          uVar70 = 0;
                          do {
                            bVar102 = puVar59[uVar84];
                            bVar6 = local_238[(uint)uVar84 & 7];
                            local_238[(uint)uVar84 + 5 & 7] = bVar102;
                            uVar70 = uVar70 + ((uint)bVar102 - (uint)bVar6);
                            puVar59[uVar84] = (uchar)(uVar70 / 5);
                            uVar84 = uVar84 + 1;
                          } while (uVar72 != uVar84);
                          break;
                        default:
                          if (iVar94 < 0) goto LAB_0017e2c3;
                          uVar84 = 0;
                          uVar70 = 0;
                          do {
                            bVar102 = puVar59[uVar84];
                            bVar6 = local_238[(uint)uVar84 & 7];
                            local_238[uVar86 + (uint)uVar84 & 7] = bVar102;
                            uVar70 = uVar70 + ((uint)bVar102 - (uint)bVar6);
                            puVar59[uVar84] = (uchar)(uVar70 / uVar86);
                            uVar84 = uVar84 + 1;
                          } while (uVar72 != uVar84);
                        }
                        if ((int)uVar71 < (int)uVar99) {
                          uVar84 = (ulong)uVar71;
                          do {
                            if (puVar59[uVar84] != '\0') {
                              __assert_fail("pixels[i] == 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                            ,0xf21,
                                            "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar70 = uVar70 - (byte)local_238[(uint)uVar84 & 7];
                            puVar59[uVar84] = (uchar)(uVar70 / uVar86);
                            uVar84 = uVar84 + 1;
                          } while ((int)uVar84 < (int)uVar99);
                        }
                        puVar59 = puVar59 + lVar53;
                        iVar73 = iVar73 + 1;
                      } while (iVar73 != local_468._0_4_);
                      uVar72 = (ulong)*(ushort *)(local_430 + 8);
                      uVar46 = *(ushort *)(local_430 + 10);
                      uVar77 = (uint)*(ushort *)(local_430 + 4);
                      uVar116 = *(ushort *)(local_430 + 6);
                    }
                  }
                  sVar83 = (short)uVar72;
                  uVar86 = local_3b0.v_oversample;
                  uVar84 = (ulong)local_3b0.v_oversample;
                  if (1 < uVar84) {
                    lVar53 = (long)local_3b0.stride_in_bytes;
                    local_238._0_8_ = (uchar *)0x0;
                    iVar73 = 0;
                    if ((short)uVar77 == 0) {
                      uVar77 = 0;
                    }
                    else {
                      local_478._0_4_ = uVar77;
                      pbVar96 = local_3b0.pixels + (ulong)uVar46 * lVar53 + uVar72;
                      local_468._0_4_ = CONCAT22(0,uVar116);
                      iVar94 = CONCAT22(0,uVar116) - local_3b0.v_oversample;
                      uVar77 = iVar94 + 1;
                      uVar72 = (ulong)uVar77;
                      do {
                        memset(local_238,0,uVar84);
                        uVar99 = uVar77;
                        switch(uVar86) {
                        case 2:
                          if (iVar94 < 0) {
LAB_0017e560:
                            uVar71 = 0;
                            uVar99 = 0;
                          }
                          else {
                            uVar75 = 0;
                            uVar71 = 0;
                            pbVar89 = pbVar96;
                            do {
                              bVar102 = *pbVar89;
                              bVar6 = local_238[(uint)uVar75 & 7];
                              local_238[(uint)uVar75 + 2 & 7] = bVar102;
                              uVar71 = uVar71 + ((uint)bVar102 - (uint)bVar6);
                              *pbVar89 = (byte)(uVar71 >> 1);
                              uVar75 = uVar75 + 1;
                              pbVar89 = pbVar89 + lVar53;
                            } while (uVar72 != uVar75);
                          }
                          break;
                        case 3:
                          if (iVar94 < 0) goto LAB_0017e560;
                          uVar75 = 0;
                          uVar71 = 0;
                          pbVar89 = pbVar96;
                          do {
                            bVar102 = *pbVar89;
                            bVar6 = local_238[(uint)uVar75 & 7];
                            local_238[(uint)uVar75 + 3 & 7] = bVar102;
                            uVar71 = uVar71 + ((uint)bVar102 - (uint)bVar6);
                            *pbVar89 = (byte)(uVar71 / 3);
                            uVar75 = uVar75 + 1;
                            pbVar89 = pbVar89 + lVar53;
                          } while (uVar72 != uVar75);
                          break;
                        case 4:
                          if (iVar94 < 0) goto LAB_0017e560;
                          uVar75 = 0;
                          uVar71 = 0;
                          pbVar89 = pbVar96;
                          do {
                            bVar102 = *pbVar89;
                            uVar88 = (ulong)((uint)uVar75 & 7);
                            local_238[uVar88 ^ 4] = bVar102;
                            uVar71 = uVar71 + ((uint)bVar102 - (uint)(byte)local_238[uVar88]);
                            *pbVar89 = (byte)(uVar71 >> 2);
                            uVar75 = uVar75 + 1;
                            pbVar89 = pbVar89 + lVar53;
                          } while (uVar72 != uVar75);
                          break;
                        case 5:
                          if (iVar94 < 0) goto LAB_0017e560;
                          uVar75 = 0;
                          uVar71 = 0;
                          pbVar89 = pbVar96;
                          do {
                            bVar102 = *pbVar89;
                            bVar6 = local_238[(uint)uVar75 & 7];
                            local_238[(uint)uVar75 + 5 & 7] = bVar102;
                            uVar71 = uVar71 + ((uint)bVar102 - (uint)bVar6);
                            *pbVar89 = (byte)(uVar71 / 5);
                            uVar75 = uVar75 + 1;
                            pbVar89 = pbVar89 + lVar53;
                          } while (uVar72 != uVar75);
                          break;
                        default:
                          if (iVar94 < 0) goto LAB_0017e560;
                          uVar75 = 0;
                          uVar71 = 0;
                          pbVar89 = pbVar96;
                          do {
                            bVar102 = *pbVar89;
                            bVar6 = local_238[(uint)uVar75 & 7];
                            local_238[uVar86 + (uint)uVar75 & 7] = bVar102;
                            uVar71 = uVar71 + ((uint)bVar102 - (uint)bVar6);
                            *pbVar89 = (byte)(uVar71 / uVar86);
                            uVar75 = uVar75 + 1;
                            pbVar89 = pbVar89 + lVar53;
                          } while (uVar72 != uVar75);
                        }
                        iVar91 = local_468._0_4_ - uVar99;
                        if (iVar91 != 0 && (int)uVar99 <= (int)local_468._0_4_) {
                          lVar74 = (long)(int)uVar99;
                          pbVar89 = pbVar96 + lVar53 * lVar74;
                          do {
                            if (*pbVar89 != 0) {
                              __assert_fail("pixels[i*stride_in_bytes] == 0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_truetype.h"
                                            ,0xf5f,
                                            "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                           );
                            }
                            uVar71 = uVar71 - (byte)local_238[(uint)lVar74 & 7];
                            *pbVar89 = (byte)(uVar71 / uVar86);
                            lVar74 = lVar74 + 1;
                            pbVar89 = pbVar89 + lVar53;
                            iVar91 = iVar91 + -1;
                          } while (iVar91 != 0);
                        }
                        pbVar96 = pbVar96 + 1;
                        iVar73 = iVar73 + 1;
                      } while (iVar73 != local_478._0_4_);
                      sVar83 = *(short *)(local_430 + 8);
                      uVar46 = *(ushort *)(local_430 + 10);
                      uVar77 = (uint)*(ushort *)(local_430 + 4);
                      uVar116 = *(ushort *)(local_430 + 6);
                    }
                  }
                  *local_2a0 = sVar83;
                  local_2a0[1] = uVar46;
                  local_2a0[2] = sVar83 + (short)uVar77;
                  local_2a0[3] = uVar116 + uVar46;
                  *(float *)(local_2a0 + 8) =
                       (float)(int)(short)((short)(local_340 << 8) + (short)local_344) * local_378;
                  *(ulong *)(local_2a0 + 4) =
                       CONCAT44((float)local_33c * local_258._4_4_ + local_248._4_4_,
                                (float)(int)local_440 * local_258._0_4_ + local_248._0_4_);
                  *(float *)(local_2a0 + 10) =
                       (float)(int)(uVar77 + local_440) * local_258._0_4_ + local_248._0_4_;
                  *(float *)(local_2a0 + 0xc) =
                       (float)(int)((uint)uVar116 + local_33c) * (float)local_268._0_4_ +
                       (float)local_278._0_4_;
                  iVar73 = *(int *)(local_358 + 0x10);
                  lVar53 = local_298;
                  lVar74 = local_310;
                  uVar72 = local_438;
                  lVar98 = local_358;
                }
                lVar53 = lVar53 + 1;
                uVar72 = uVar72 + 1;
                lVar61 = local_2d8;
                lVar93 = local_2c8;
              } while ((long)uVar72 < (long)iVar73);
            }
            lVar93 = lVar93 + 1;
          } while (lVar93 != local_2d0);
        }
        local_3b0.h_oversample = (undefined4)local_288;
        local_3b0.v_oversample = local_288._4_4_;
        fVar109 = *(float *)(local_2f0->Name + local_2f8 + -4);
        if ((fVar109 != 1.0) || (NAN(fVar109))) {
          lVar53 = 0;
          auVar115 = _DAT_001b57e0;
          auVar120 = _DAT_001b57d0;
          auVar124 = _DAT_001b57c0;
          auVar126 = _DAT_001b57b0;
          do {
            auVar111 = auVar120 & _DAT_001b57f0 | _DAT_001b5800;
            uVar86 = auVar120._4_4_;
            uVar77 = auVar120._8_4_;
            uVar99 = auVar120._12_4_;
            auVar148 = auVar115 & _DAT_001b57f0 | _DAT_001b5800;
            uVar71 = auVar115._4_4_;
            uVar70 = auVar115._8_4_;
            uVar140 = auVar115._12_4_;
            auVar159 = auVar126 & _DAT_001b57f0 | _DAT_001b5800;
            uVar151 = auVar126._4_4_;
            uVar153 = auVar126._8_4_;
            uVar155 = auVar126._12_4_;
            auVar104 = auVar124 & _DAT_001b57f0 | _DAT_001b5800;
            uVar165 = auVar124._4_4_;
            uVar167 = auVar124._8_4_;
            uVar169 = auVar124._12_4_;
            fVar158 = (((float)(auVar124._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar104._0_4_) * fVar109;
            fVar166 = (((float)(uVar165 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar104._4_4_) *
                      fVar109;
            fVar168 = (((float)(uVar167 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar104._8_4_) *
                      fVar109;
            fVar170 = (((float)(uVar169 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar104._12_4_) *
                      fVar109;
            fVar142 = (((float)(auVar126._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar159._0_4_) * fVar109;
            fVar152 = (((float)(uVar151 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar159._4_4_) *
                      fVar109;
            fVar154 = (((float)(uVar153 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar159._8_4_) *
                      fVar109;
            fVar156 = (((float)(uVar155 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar159._12_4_) *
                      fVar109;
            fVar122 = (((float)(auVar115._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar148._0_4_) * fVar109;
            fVar134 = (((float)(uVar71 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar148._4_4_) *
                      fVar109;
            fVar157 = (((float)(uVar70 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar148._8_4_) *
                      fVar109;
            fVar141 = (((float)(uVar140 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar148._12_4_) *
                      fVar109;
            fVar127 = (((float)(auVar120._0_4_ >> 0x10 | 0x53000000) - 5.497642e+11) +
                      auVar111._0_4_) * fVar109;
            fVar132 = (((float)(uVar86 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar111._4_4_) *
                      fVar109;
            fVar103 = (((float)(uVar77 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar111._8_4_) *
                      fVar109;
            fVar117 = (((float)(uVar99 >> 0x10 | 0x53000000) - 5.497642e+11) + auVar111._12_4_) *
                      fVar109;
            auVar131._0_4_ = (int)fVar127;
            auVar131._4_4_ = (int)fVar132;
            auVar131._8_4_ = (int)fVar103;
            auVar131._12_4_ = (int)fVar117;
            auVar182._0_4_ = auVar131._0_4_ >> 0x1f;
            auVar182._4_4_ = auVar131._4_4_ >> 0x1f;
            auVar182._8_4_ = auVar131._8_4_ >> 0x1f;
            auVar182._12_4_ = auVar131._12_4_ >> 0x1f;
            fVar187 = (float)DAT_001b5830;
            fVar189 = DAT_001b5830._4_4_;
            fVar190 = DAT_001b5830._8_4_;
            fVar191 = DAT_001b5830._12_4_;
            auVar130._0_4_ = (int)(fVar127 - fVar187);
            auVar130._4_4_ = (int)(fVar132 - fVar189);
            auVar130._8_4_ = (int)(fVar103 - fVar190);
            auVar130._12_4_ = (int)(fVar117 - fVar191);
            auVar131 = auVar130 & auVar182 | auVar131;
            auVar138._0_4_ = (int)fVar122;
            auVar138._4_4_ = (int)fVar134;
            auVar138._8_4_ = (int)fVar157;
            auVar138._12_4_ = (int)fVar141;
            auVar183._0_4_ = auVar138._0_4_ >> 0x1f;
            auVar183._4_4_ = auVar138._4_4_ >> 0x1f;
            auVar183._8_4_ = auVar138._8_4_ >> 0x1f;
            auVar183._12_4_ = auVar138._12_4_ >> 0x1f;
            auVar137._0_4_ = (int)(fVar122 - fVar187);
            auVar137._4_4_ = (int)(fVar134 - fVar189);
            auVar137._8_4_ = (int)(fVar157 - fVar190);
            auVar137._12_4_ = (int)(fVar141 - fVar191);
            auVar138 = auVar137 & auVar183 | auVar138;
            auVar178._0_4_ = (int)fVar142;
            auVar178._4_4_ = (int)fVar152;
            auVar178._8_4_ = (int)fVar154;
            auVar178._12_4_ = (int)fVar156;
            auVar188._0_4_ = auVar178._0_4_ >> 0x1f;
            auVar188._4_4_ = auVar178._4_4_ >> 0x1f;
            auVar188._8_4_ = auVar178._8_4_ >> 0x1f;
            auVar188._12_4_ = auVar178._12_4_ >> 0x1f;
            auVar177._0_4_ = (int)(fVar142 - 2.1474836e+09);
            auVar177._4_4_ = (int)(fVar152 - 2.1474836e+09);
            auVar177._8_4_ = (int)(fVar154 - 2.1474836e+09);
            auVar177._12_4_ = (int)(fVar156 - 2.1474836e+09);
            auVar178 = auVar177 & auVar188 | auVar178;
            auVar161._0_4_ = (int)fVar158;
            auVar161._4_4_ = (int)fVar166;
            auVar161._8_4_ = (int)fVar168;
            auVar161._12_4_ = (int)fVar170;
            auVar184._0_4_ = auVar161._0_4_ >> 0x1f;
            auVar184._4_4_ = auVar161._4_4_ >> 0x1f;
            auVar184._8_4_ = auVar161._8_4_ >> 0x1f;
            auVar184._12_4_ = auVar161._12_4_ >> 0x1f;
            auVar160._0_4_ = (int)(fVar158 - fVar187);
            auVar160._4_4_ = (int)(fVar166 - fVar189);
            auVar160._8_4_ = (int)(fVar168 - fVar190);
            auVar160._12_4_ = (int)(fVar170 - fVar191);
            auVar161 = auVar160 & auVar184 | auVar161;
            auVar185._8_4_ = 0x80000000;
            auVar185._0_8_ = 0x8000000080000000;
            auVar185._12_4_ = 0x80000000;
            auVar185 = auVar161 ^ auVar185;
            auVar149._0_4_ = -(uint)(auVar185._0_4_ < -0x7fffff01);
            auVar149._4_4_ = -(uint)(auVar185._4_4_ < -0x7fffff01);
            auVar149._8_4_ = -(uint)(auVar185._8_4_ < -0x7fffff01);
            auVar149._12_4_ = -(uint)(auVar185._12_4_ < -0x7fffff01);
            auVar111 = ~auVar149 & _DAT_001b5850 | auVar161 & auVar149;
            auVar162._8_4_ = 0x80000000;
            auVar162._0_8_ = 0x8000000080000000;
            auVar162._12_4_ = 0x80000000;
            auVar162 = auVar178 ^ auVar162;
            auVar186._0_4_ = -(uint)(auVar162._0_4_ < -0x7fffff01);
            auVar186._4_4_ = -(uint)(auVar162._4_4_ < -0x7fffff01);
            auVar186._8_4_ = -(uint)(auVar162._8_4_ < -0x7fffff01);
            auVar186._12_4_ = -(uint)(auVar162._12_4_ < -0x7fffff01);
            auVar148 = ~auVar186 & _DAT_001b5850 | auVar178 & auVar186;
            sVar83 = auVar111._0_2_;
            cVar12 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[0] - (0xff < sVar83);
            sVar83 = auVar111._2_2_;
            sVar47 = CONCAT11((0 < sVar83) * (sVar83 < 0x100) * auVar111[2] - (0xff < sVar83),cVar12
                             );
            sVar83 = auVar111._4_2_;
            cVar106 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[4] - (0xff < sVar83);
            sVar83 = auVar111._6_2_;
            uVar143 = CONCAT13((0 < sVar83) * (sVar83 < 0x100) * auVar111[6] - (0xff < sVar83),
                               CONCAT12(cVar106,sVar47));
            sVar83 = auVar111._8_2_;
            cVar13 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[8] - (0xff < sVar83);
            sVar83 = auVar111._10_2_;
            uVar144 = CONCAT15((0 < sVar83) * (sVar83 < 0x100) * auVar111[10] - (0xff < sVar83),
                               CONCAT14(cVar13,uVar143));
            sVar83 = auVar111._12_2_;
            cVar14 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[0xc] - (0xff < sVar83);
            sVar83 = auVar111._14_2_;
            uVar145 = CONCAT17((0 < sVar83) * (sVar83 < 0x100) * auVar111[0xe] - (0xff < sVar83),
                               CONCAT16(cVar14,uVar144));
            sVar83 = auVar148._0_2_;
            cVar15 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[0] - (0xff < sVar83);
            sVar83 = auVar148._2_2_;
            auVar146._0_10_ =
                 CONCAT19((0 < sVar83) * (sVar83 < 0x100) * auVar148[2] - (0xff < sVar83),
                          CONCAT18(cVar15,uVar145));
            sVar83 = auVar148._4_2_;
            cVar16 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[4] - (0xff < sVar83);
            auVar146[10] = cVar16;
            sVar83 = auVar148._6_2_;
            auVar146[0xb] = (0 < sVar83) * (sVar83 < 0x100) * auVar148[6] - (0xff < sVar83);
            sVar83 = auVar148._8_2_;
            cVar108 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[8] - (0xff < sVar83);
            auVar147[0xc] = cVar108;
            auVar147._0_12_ = auVar146;
            sVar83 = auVar148._10_2_;
            auVar147[0xd] = (0 < sVar83) * (sVar83 < 0x100) * auVar148[10] - (0xff < sVar83);
            sVar83 = auVar148._12_2_;
            cVar107 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[0xc] - (0xff < sVar83);
            auVar150[0xe] = cVar107;
            auVar150._0_14_ = auVar147;
            sVar83 = auVar148._14_2_;
            auVar150[0xf] = (0 < sVar83) * (sVar83 < 0x100) * auVar148[0xe] - (0xff < sVar83);
            auVar163._8_4_ = 0x80000000;
            auVar163._0_8_ = 0x8000000080000000;
            auVar163._12_4_ = 0x80000000;
            auVar163 = auVar138 ^ auVar163;
            auVar179._0_4_ = -(uint)(auVar163._0_4_ < -0x7fffff01);
            auVar179._4_4_ = -(uint)(auVar163._4_4_ < -0x7fffff01);
            auVar179._8_4_ = -(uint)(auVar163._8_4_ < -0x7fffff01);
            auVar179._12_4_ = -(uint)(auVar163._12_4_ < -0x7fffff01);
            auVar148 = ~auVar179 & _DAT_001b5850 | auVar138 & auVar179;
            auVar139._8_4_ = 0x80000000;
            auVar139._0_8_ = 0x8000000080000000;
            auVar139._12_4_ = 0x80000000;
            auVar139 = auVar131 ^ auVar139;
            auVar164._0_4_ = -(uint)(auVar139._0_4_ < -0x7fffff01);
            auVar164._4_4_ = -(uint)(auVar139._4_4_ < -0x7fffff01);
            auVar164._8_4_ = -(uint)(auVar139._8_4_ < -0x7fffff01);
            auVar164._12_4_ = -(uint)(auVar139._12_4_ < -0x7fffff01);
            auVar111 = ~auVar164 & _DAT_001b5850 | auVar131 & auVar164;
            sVar83 = auVar148._0_2_;
            cVar17 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[0] - (0xff < sVar83);
            sVar83 = auVar148._2_2_;
            sVar171 = CONCAT11((0 < sVar83) * (sVar83 < 0x100) * auVar148[2] - (0xff < sVar83),
                               cVar17);
            sVar83 = auVar148._4_2_;
            cVar18 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[4] - (0xff < sVar83);
            sVar83 = auVar148._6_2_;
            uVar172 = CONCAT13((0 < sVar83) * (sVar83 < 0x100) * auVar148[6] - (0xff < sVar83),
                               CONCAT12(cVar18,sVar171));
            sVar83 = auVar148._8_2_;
            cVar19 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[8] - (0xff < sVar83);
            sVar83 = auVar148._10_2_;
            uVar173 = CONCAT15((0 < sVar83) * (sVar83 < 0x100) * auVar148[10] - (0xff < sVar83),
                               CONCAT14(cVar19,uVar172));
            sVar83 = auVar148._12_2_;
            cVar20 = (0 < sVar83) * (sVar83 < 0x100) * auVar148[0xc] - (0xff < sVar83);
            sVar83 = auVar148._14_2_;
            uVar174 = CONCAT17((0 < sVar83) * (sVar83 < 0x100) * auVar148[0xe] - (0xff < sVar83),
                               CONCAT16(cVar20,uVar173));
            sVar83 = auVar111._0_2_;
            cVar21 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[0] - (0xff < sVar83);
            sVar83 = auVar111._2_2_;
            auVar175._0_10_ =
                 CONCAT19((0 < sVar83) * (sVar83 < 0x100) * auVar111[2] - (0xff < sVar83),
                          CONCAT18(cVar21,uVar174));
            sVar83 = auVar111._4_2_;
            cVar22 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[4] - (0xff < sVar83);
            auVar175[10] = cVar22;
            sVar83 = auVar111._6_2_;
            auVar175[0xb] = (0 < sVar83) * (sVar83 < 0x100) * auVar111[6] - (0xff < sVar83);
            sVar83 = auVar111._8_2_;
            cVar23 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[8] - (0xff < sVar83);
            auVar176[0xc] = cVar23;
            auVar176._0_12_ = auVar175;
            sVar83 = auVar111._10_2_;
            auVar176[0xd] = (0 < sVar83) * (sVar83 < 0x100) * auVar111[10] - (0xff < sVar83);
            sVar83 = auVar111._12_2_;
            cVar24 = (0 < sVar83) * (sVar83 < 0x100) * auVar111[0xc] - (0xff < sVar83);
            auVar180[0xe] = cVar24;
            auVar180._0_14_ = auVar176;
            sVar83 = auVar111._14_2_;
            auVar180[0xf] = (0 < sVar83) * (sVar83 < 0x100) * auVar111[0xe] - (0xff < sVar83);
            sVar83 = (short)((uint)uVar172 >> 0x10);
            auVar181[1] = (0 < sVar83) * (sVar83 < 0x100) * cVar18 - (0xff < sVar83);
            auVar181[0] = (0 < sVar171) * (sVar171 < 0x100) * cVar17 - (0xff < sVar171);
            sVar83 = (short)((uint6)uVar173 >> 0x20);
            auVar181[2] = (0 < sVar83) * (sVar83 < 0x100) * cVar19 - (0xff < sVar83);
            sVar83 = (short)((ulong)uVar174 >> 0x30);
            auVar181[3] = (0 < sVar83) * (sVar83 < 0x100) * cVar20 - (0xff < sVar83);
            sVar83 = (short)((unkuint10)auVar175._0_10_ >> 0x40);
            auVar181[4] = (0 < sVar83) * (sVar83 < 0x100) * cVar21 - (0xff < sVar83);
            sVar83 = auVar175._10_2_;
            auVar181[5] = (0 < sVar83) * (sVar83 < 0x100) * cVar22 - (0xff < sVar83);
            sVar83 = auVar176._12_2_;
            auVar181[6] = (0 < sVar83) * (sVar83 < 0x100) * cVar23 - (0xff < sVar83);
            sVar83 = auVar180._14_2_;
            auVar181[7] = (0 < sVar83) * (sVar83 < 0x100) * cVar24 - (0xff < sVar83);
            auVar181[8] = (0 < sVar47) * (sVar47 < 0x100) * cVar12 - (0xff < sVar47);
            sVar83 = (short)((uint)uVar143 >> 0x10);
            auVar181[9] = (0 < sVar83) * (sVar83 < 0x100) * cVar106 - (0xff < sVar83);
            sVar83 = (short)((uint6)uVar144 >> 0x20);
            auVar181[10] = (0 < sVar83) * (sVar83 < 0x100) * cVar13 - (0xff < sVar83);
            sVar83 = (short)((ulong)uVar145 >> 0x30);
            auVar181[0xb] = (0 < sVar83) * (sVar83 < 0x100) * cVar14 - (0xff < sVar83);
            sVar83 = (short)((unkuint10)auVar146._0_10_ >> 0x40);
            auVar181[0xc] = (0 < sVar83) * (sVar83 < 0x100) * cVar15 - (0xff < sVar83);
            sVar83 = auVar146._10_2_;
            auVar181[0xd] = (0 < sVar83) * (sVar83 < 0x100) * cVar16 - (0xff < sVar83);
            sVar83 = auVar147._12_2_;
            auVar181[0xe] = (0 < sVar83) * (sVar83 < 0x100) * cVar108 - (0xff < sVar83);
            sVar83 = auVar150._14_2_;
            auVar181[0xf] = (0 < sVar83) * (sVar83 < 0x100) * cVar107 - (0xff < sVar83);
            *(undefined1 (*) [16])(local_238 + lVar53) = auVar181;
            lVar53 = lVar53 + 0x10;
            iVar73 = (int)DAT_001b5860;
            auVar115._0_4_ = auVar115._0_4_ + iVar73;
            iVar94 = DAT_001b5860._4_4_;
            auVar115._4_4_ = uVar71 + iVar94;
            iVar91 = DAT_001b5860._8_4_;
            auVar115._8_4_ = uVar70 + iVar91;
            iVar133 = DAT_001b5860._12_4_;
            auVar115._12_4_ = uVar140 + iVar133;
            auVar120._0_4_ = auVar120._0_4_ + iVar73;
            auVar120._4_4_ = uVar86 + iVar94;
            auVar120._8_4_ = uVar77 + iVar91;
            auVar120._12_4_ = uVar99 + iVar133;
            auVar124._0_4_ = auVar124._0_4_ + iVar73;
            auVar124._4_4_ = uVar165 + iVar94;
            auVar124._8_4_ = uVar167 + iVar91;
            auVar124._12_4_ = uVar169 + iVar133;
            auVar126._0_4_ = auVar126._0_4_ + iVar73;
            auVar126._4_4_ = uVar151 + iVar94;
            auVar126._8_4_ = uVar153 + iVar91;
            auVar126._12_4_ = uVar155 + iVar133;
          } while (lVar53 != 0x100);
          iVar73 = *(int *)&local_410[1].data;
          if (iVar73 != 0) {
            pvVar57 = local_410[1].userdata;
            pvVar58 = pvVar57;
            do {
              if ((*(int *)((long)pvVar57 + 0xc) != 0) && (*(ushort *)((long)pvVar57 + 6) != 0)) {
                uVar46 = *(ushort *)((long)pvVar57 + 4);
                puVar59 = local_3b0.pixels +
                          (ulong)*(ushort *)((long)pvVar57 + 10) * (long)local_3b0.stride_in_bytes +
                          (ulong)*(ushort *)((long)pvVar57 + 8);
                uVar86 = (uint)*(ushort *)((long)pvVar57 + 6);
                do {
                  if ((ulong)uVar46 != 0) {
                    uVar72 = 0;
                    do {
                      puVar59[uVar72] = local_238[puVar59[uVar72]];
                      uVar72 = uVar72 + 1;
                    } while (uVar46 != uVar72);
                  }
                  puVar59 = puVar59 + local_3b0.stride_in_bytes;
                  bVar101 = 1 < (int)uVar86;
                  uVar86 = uVar86 - 1;
                } while (bVar101);
                pvVar58 = local_410[1].userdata;
                iVar73 = *(int *)&local_410[1].data;
              }
              pvVar57 = (void *)((long)pvVar57 + 0x10);
            } while (pvVar57 != (void *)((long)iVar73 * 0x10 + (long)pvVar58));
          }
        }
        local_410[1].userdata = (void *)0x0;
        lVar53 = local_2e8 + 1;
        ptr = (stbrp_context *)local_3b0.pack_info;
      } while (lVar53 < (atlas->ConfigData).Size);
    }
    ImGui::MemFree(local_3b0.nodes);
    ImGui::MemFree(ptr);
    ImGui::MemFree(local_320);
    if (0 < (atlas->ConfigData).Size) {
      lVar53 = 0;
      local_428 = ZEXT816(0x1000100010001);
      pIVar193 = atlas;
      do {
        pIVar10 = (atlas->ConfigData).Data;
        pIVar55 = pIVar10 + lVar53;
        pIVar9 = pIVar10[lVar53].DstFont;
        bVar102 = pIVar10[lVar53].MergeMode;
        if ((bool)bVar102 == true) {
          atlas = pIVar193;
          ImFont::BuildLookupTable(pIVar9);
          bVar102 = pIVar55->MergeMode;
          pIVar193 = atlas;
        }
        local_478._0_8_ = local_418 + lVar53 * 0xc;
        if ((bVar102 & 1) == 0) {
          psVar54 = ((stbrp_node *)local_478._0_8_)->next;
          iVar73 = *(int *)&((stbrp_node *)(local_478._0_8_ + 0x20))->field_0x4;
          bVar102 = (&psVar54->field_0x7)[iVar73];
          fVar127 = pIVar55->SizePixels;
          uVar7 = (&psVar54->field_0x4)[iVar73];
          bVar6 = (&psVar54->field_0x5)[iVar73];
          uVar8 = (&psVar54->field_0x6)[iVar73];
          atlas = pIVar193;
          ImFont::ClearOutputData(pIVar9);
          pIVar9->FontSize = pIVar55->SizePixels;
          pIVar9->ConfigData = pIVar55;
          pIVar9->ContainerAtlas = atlas;
          auVar36._8_7_ = 0;
          auVar36._0_8_ = SUB158(ZEXT715(0) << 0x40,7);
          auVar25._10_6_ = 0;
          auVar25._0_10_ = SUB1510(auVar36 << 0x38,5);
          auVar35._1_12_ = SUB1612(auVar25 << 0x28,4);
          auVar35[0] = uVar8;
          auVar35[0xd] = 0;
          auVar39._1_14_ = auVar35 << 8;
          auVar39[0] = uVar7;
          auVar39[0xf] = 0;
          auVar111 = ZEXT416((uint)bVar102 << 0x10 | (uint)bVar6) | auVar39 << 8;
          sVar47 = auVar111._0_2_;
          sVar83 = auVar111._2_2_;
          fVar132 = (float)((int)sVar47 - (int)sVar83);
          fVar127 = fVar127 / fVar132;
          auVar121._0_2_ = -(ushort)(sVar47 < (short)local_428._0_2_);
          auVar121._2_2_ = -(ushort)(sVar47 < (short)local_428._2_2_);
          auVar121._4_2_ = -(ushort)(sVar83 < (short)local_428._4_2_);
          auVar121._6_2_ = -(ushort)(sVar83 < (short)local_428._6_2_);
          auVar121._8_2_ = -(ushort)(0 < (short)local_428._8_2_);
          auVar121._10_2_ = -(ushort)(0 < (short)local_428._10_2_);
          auVar121._12_2_ = -(ushort)(0 < (short)local_428._12_2_);
          auVar121._14_2_ = -(ushort)(0 < (short)local_428._14_2_);
          auVar111 = auVar121 & _DAT_001aaba0 | ~auVar121 & _DAT_001aaa80;
          fVar109 = (float)(int)(fVar127 * (float)(int)sVar47 + auVar111._0_4_);
          fVar132 = (float)(int)(fVar127 * (float)(int)((long)CONCAT26(sVar83,CONCAT24((short)((uint
                                                  )fVar132 >> 0x10),fVar132)) >> 0x30) +
                                auVar111._4_4_);
          fVar103 = (float)(int)(fVar127 * 0.0 + auVar111._8_4_);
          fVar127 = (float)(int)(fVar127 * 0.0 + auVar111._12_4_);
          pIVar9->Ascent = fVar109;
          pIVar9->Descent = fVar132;
          psVar54 = (stbrp_node *)local_478._0_8_;
          pIVar193 = atlas;
        }
        else {
          fVar109 = pIVar9->Ascent;
          fVar132 = 0.0;
          fVar103 = 0.0;
          fVar127 = 0.0;
          psVar54 = (stbrp_node *)local_478._0_8_;
        }
        pIVar9->ConfigDataCount = pIVar9->ConfigDataCount + 1;
        iVar73 = *(int *)&psVar54[0xb].next;
        if (0 < iVar73) {
          fVar117 = (pIVar55->GlyphOffset).x;
          local_468._4_4_ = (float)(int)fVar132;
          local_468._0_4_ = (float)(int)(fVar109 + 0.5) + (pIVar55->GlyphOffset).y;
          fStack_460 = (float)(int)fVar103;
          fStack_45c = (float)(int)fVar127;
          lVar74 = 0;
          do {
            iVar94 = *(int *)(*(long *)(psVar54 + 0xb) + 0x10 + lVar74 * 0x28);
            if (0 < iVar94) {
              lVar61 = *(long *)(psVar54 + 0xb) + lVar74 * 0x28;
              lVar98 = 0;
              lVar93 = 0;
              do {
                lVar11 = *(long *)(lVar61 + 0x18);
                if ((((*(ushort *)(lVar11 + lVar98) != 0) || (*(short *)(lVar11 + 4 + lVar98) != 0))
                    || (*(short *)(lVar11 + 2 + lVar98) != 0)) ||
                   (*(short *)(lVar11 + 6 + lVar98) != 0)) {
                  if (((pIVar55->MergeMode != true) ||
                      (uVar72 = lVar93 + (ulong)*(uint *)(lVar61 + 4) & 0xffff,
                      (pIVar9->IndexLookup).Size <= (int)uVar72)) ||
                     (((pIVar9->IndexLookup).Data[uVar72] == 0xffff ||
                      ((pIVar9->Glyphs).Data == (ImFontGlyph *)0x0)))) {
                    fVar127 = 1.0 / (float)atlas->TexHeight;
                    fVar109 = 1.0 / (float)atlas->TexWidth;
                    atlas = pIVar193;
                    ImFont::AddGlyph(pIVar9,(short)*(uint *)(lVar61 + 4) + (short)lVar93,
                                     *(float *)(lVar11 + 8 + lVar98) + 0.0 + fVar117,
                                     *(float *)(lVar11 + 0xc + lVar98) + 0.0 + local_468._0_4_,
                                     *(float *)(lVar11 + 0x14 + lVar98) + 0.0 + fVar117,
                                     *(float *)(lVar11 + 0x18 + lVar98) + 0.0 + local_468._0_4_,
                                     (float)*(ushort *)(lVar11 + lVar98) * fVar109,
                                     (float)*(ushort *)(lVar11 + 2 + lVar98) * fVar127,
                                     (float)*(ushort *)(lVar11 + 4 + lVar98) * fVar109,
                                     (float)*(ushort *)(lVar11 + 6 + lVar98) * fVar127,
                                     *(float *)(lVar11 + 0x10 + lVar98));
                    iVar94 = *(int *)(lVar61 + 0x10);
                    pIVar193 = atlas;
                  }
                }
                lVar93 = lVar93 + 1;
                lVar98 = lVar98 + 0x1c;
              } while (lVar93 < iVar94);
              iVar73 = *(int *)&((stbrp_node *)(local_478._0_8_ + 0xb0))->next;
              psVar54 = (stbrp_node *)local_478._0_8_;
            }
            lVar74 = lVar74 + 1;
          } while (lVar74 < iVar73);
        }
        lVar53 = lVar53 + 1;
      } while (lVar53 < (atlas->ConfigData).Size);
    }
    ImGui::MemFree(local_328);
    ImGui::MemFree(local_368);
    ImGui::MemFree(local_418);
    ImFontAtlasBuildFinish(atlas);
    bVar101 = true;
  }
  return bVar101;
}

Assistant:

bool    ImFontAtlasBuildWithStbTruetype(ImFontAtlas* atlas)
{
    IM_ASSERT(atlas->ConfigData.Size > 0);

    ImFontAtlasBuildRegisterDefaultCustomRects(atlas);

    atlas->TexID = NULL;
    atlas->TexWidth = atlas->TexHeight = 0;
    atlas->TexUvScale = ImVec2(0.0f, 0.0f);
    atlas->TexUvWhitePixel = ImVec2(0.0f, 0.0f);
    atlas->ClearTexData();

    // Count glyphs/ranges
    int total_glyphs_count = 0;
    int total_ranges_count = 0;
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        if (!cfg.GlyphRanges)
            cfg.GlyphRanges = atlas->GetGlyphRangesDefault();
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, total_ranges_count++)
            total_glyphs_count += (in_range[1] - in_range[0]) + 1;
    }

    // We need a width for the skyline algorithm. Using a dumb heuristic here to decide of width. User can override TexDesiredWidth and TexGlyphPadding if they wish.
    // Width doesn't really matter much, but some API/GPU have texture size limitations and increasing width can decrease height.
    atlas->TexWidth = (atlas->TexDesiredWidth > 0) ? atlas->TexDesiredWidth : (total_glyphs_count > 4000) ? 4096 : (total_glyphs_count > 2000) ? 2048 : (total_glyphs_count > 1000) ? 1024 : 512;
    atlas->TexHeight = 0;

    // Start packing
    const int max_tex_height = 1024*32;
    stbtt_pack_context spc = {};
    if (!stbtt_PackBegin(&spc, NULL, atlas->TexWidth, max_tex_height, 0, atlas->TexGlyphPadding, NULL))
        return false;
    stbtt_PackSetOversampling(&spc, 1, 1);

    // Pack our extra data rectangles first, so it will be on the upper-left corner of our texture (UV will have small values).
    ImFontAtlasBuildPackCustomRects(atlas, spc.pack_info);

    // Initialize font information (so we can error without any cleanup)
    struct ImFontTempBuildData
    {
        stbtt_fontinfo      FontInfo;
        stbrp_rect*         Rects;
        int                 RectsCount;
        stbtt_pack_range*   Ranges;
        int                 RangesCount;
    };
    ImFontTempBuildData* tmp_array = (ImFontTempBuildData*)ImGui::MemAlloc((size_t)atlas->ConfigData.Size * sizeof(ImFontTempBuildData));
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        IM_ASSERT(cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas));

        const int font_offset = stbtt_GetFontOffsetForIndex((unsigned char*)cfg.FontData, cfg.FontNo);
        IM_ASSERT(font_offset >= 0 && "FontData is incorrect, or FontNo cannot be found.");
        if (!stbtt_InitFont(&tmp.FontInfo, (unsigned char*)cfg.FontData, font_offset))
        {
            atlas->TexWidth = atlas->TexHeight = 0; // Reset output on failure
            ImGui::MemFree(tmp_array);
            return false;
        }
    }

    // Allocate packing character data and flag packed characters buffer as non-packed (x0=y0=x1=y1=0)
    int buf_packedchars_n = 0, buf_rects_n = 0, buf_ranges_n = 0;
    stbtt_packedchar* buf_packedchars = (stbtt_packedchar*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbtt_packedchar));
    stbrp_rect* buf_rects = (stbrp_rect*)ImGui::MemAlloc(total_glyphs_count * sizeof(stbrp_rect));
    stbtt_pack_range* buf_ranges = (stbtt_pack_range*)ImGui::MemAlloc(total_ranges_count * sizeof(stbtt_pack_range));
    memset(buf_packedchars, 0, total_glyphs_count * sizeof(stbtt_packedchar));
    memset(buf_rects, 0, total_glyphs_count * sizeof(stbrp_rect));              // Unnecessary but let's clear this for the sake of sanity.
    memset(buf_ranges, 0, total_ranges_count * sizeof(stbtt_pack_range));

    // First font pass: pack all glyphs (no rendering at this point, we are working with rectangles in an infinitely tall texture at this point)
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];

        // Setup ranges
        int font_glyphs_count = 0;
        int font_ranges_count = 0;
        for (const ImWchar* in_range = cfg.GlyphRanges; in_range[0] && in_range[1]; in_range += 2, font_ranges_count++)
            font_glyphs_count += (in_range[1] - in_range[0]) + 1;
        tmp.Ranges = buf_ranges + buf_ranges_n;
        tmp.RangesCount = font_ranges_count;
        buf_ranges_n += font_ranges_count;
        for (int i = 0; i < font_ranges_count; i++)
        {
            const ImWchar* in_range = &cfg.GlyphRanges[i * 2];
            stbtt_pack_range& range = tmp.Ranges[i];
            range.font_size = cfg.SizePixels;
            range.first_unicode_codepoint_in_range = in_range[0];
            range.num_chars = (in_range[1] - in_range[0]) + 1;
            range.chardata_for_range = buf_packedchars + buf_packedchars_n;
            buf_packedchars_n += range.num_chars;
        }

        // Gather the sizes of all rectangle we need
        tmp.Rects = buf_rects + buf_rects_n;
        tmp.RectsCount = font_glyphs_count;
        buf_rects_n += font_glyphs_count;
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        int n = stbtt_PackFontRangesGatherRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        IM_ASSERT(n == font_glyphs_count);

        // Detect missing glyphs and replace them with a zero-sized box instead of relying on the default glyphs
        // This allows us merging overlapping icon fonts more easily.
        int rect_i = 0;
        for (int range_i = 0; range_i < tmp.RangesCount; range_i++)
            for (int char_i = 0; char_i < tmp.Ranges[range_i].num_chars; char_i++, rect_i++)
                if (stbtt_FindGlyphIndex(&tmp.FontInfo, tmp.Ranges[range_i].first_unicode_codepoint_in_range + char_i) == 0)
                    tmp.Rects[rect_i].w = tmp.Rects[rect_i].h = 0;

        // Pack
        stbrp_pack_rects((stbrp_context*)spc.pack_info, tmp.Rects, n);

        // Extend texture height
        // Also mark missing glyphs as non-packed so we don't attempt to render into them
        for (int i = 0; i < n; i++)
        {
            if (tmp.Rects[i].w == 0 && tmp.Rects[i].h == 0)
                tmp.Rects[i].was_packed = 0;
            if (tmp.Rects[i].was_packed)
                atlas->TexHeight = ImMax(atlas->TexHeight, tmp.Rects[i].y + tmp.Rects[i].h);
        }
    }
    IM_ASSERT(buf_rects_n == total_glyphs_count);
    IM_ASSERT(buf_packedchars_n == total_glyphs_count);
    IM_ASSERT(buf_ranges_n == total_ranges_count);

    // Create texture
    atlas->TexHeight = (atlas->Flags & ImFontAtlasFlags_NoPowerOfTwoHeight) ? (atlas->TexHeight + 1) : ImUpperPowerOfTwo(atlas->TexHeight);
    atlas->TexUvScale = ImVec2(1.0f / atlas->TexWidth, 1.0f / atlas->TexHeight);
    atlas->TexPixelsAlpha8 = (unsigned char*)ImGui::MemAlloc(atlas->TexWidth * atlas->TexHeight);
    memset(atlas->TexPixelsAlpha8, 0, atlas->TexWidth * atlas->TexHeight);
    spc.pixels = atlas->TexPixelsAlpha8;
    spc.height = atlas->TexHeight;

    // Second pass: render font characters
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        stbtt_PackSetOversampling(&spc, cfg.OversampleH, cfg.OversampleV);
        stbtt_PackFontRangesRenderIntoRects(&spc, &tmp.FontInfo, tmp.Ranges, tmp.RangesCount, tmp.Rects);
        if (cfg.RasterizerMultiply != 1.0f)
        {
            unsigned char multiply_table[256];
            ImFontAtlasBuildMultiplyCalcLookupTable(multiply_table, cfg.RasterizerMultiply);
            for (const stbrp_rect* r = tmp.Rects; r != tmp.Rects + tmp.RectsCount; r++)
                if (r->was_packed)
                    ImFontAtlasBuildMultiplyRectAlpha8(multiply_table, spc.pixels, r->x, r->y, r->w, r->h, spc.stride_in_bytes);
        }
        tmp.Rects = NULL;
    }

    // End packing
    stbtt_PackEnd(&spc);
    ImGui::MemFree(buf_rects);
    buf_rects = NULL;

    // Third pass: setup ImFont and glyphs for runtime
    for (int input_i = 0; input_i < atlas->ConfigData.Size; input_i++)
    {
        ImFontConfig& cfg = atlas->ConfigData[input_i];
        ImFontTempBuildData& tmp = tmp_array[input_i];
        ImFont* dst_font = cfg.DstFont; // We can have multiple input fonts writing into a same destination font (when using MergeMode=true)
        if (cfg.MergeMode)
            dst_font->BuildLookupTable();

        const float font_scale = stbtt_ScaleForPixelHeight(&tmp.FontInfo, cfg.SizePixels);
        int unscaled_ascent, unscaled_descent, unscaled_line_gap;
        stbtt_GetFontVMetrics(&tmp.FontInfo, &unscaled_ascent, &unscaled_descent, &unscaled_line_gap);

        const float ascent = ImFloor(unscaled_ascent * font_scale + ((unscaled_ascent > 0.0f) ? +1 : -1));
        const float descent = ImFloor(unscaled_descent * font_scale + ((unscaled_descent > 0.0f) ? +1 : -1));
        ImFontAtlasBuildSetupFont(atlas, dst_font, &cfg, ascent, descent);
        const float off_x = cfg.GlyphOffset.x;
        const float off_y = cfg.GlyphOffset.y + (float)(int)(dst_font->Ascent + 0.5f);

        for (int i = 0; i < tmp.RangesCount; i++)
        {
            stbtt_pack_range& range = tmp.Ranges[i];
            for (int char_idx = 0; char_idx < range.num_chars; char_idx += 1)
            {
                const stbtt_packedchar& pc = range.chardata_for_range[char_idx];
                if (!pc.x0 && !pc.x1 && !pc.y0 && !pc.y1)
                    continue;

                const int codepoint = range.first_unicode_codepoint_in_range + char_idx;
                if (cfg.MergeMode && dst_font->FindGlyphNoFallback((unsigned short)codepoint))
                    continue;

                stbtt_aligned_quad q;
                float dummy_x = 0.0f, dummy_y = 0.0f;
                stbtt_GetPackedQuad(range.chardata_for_range, atlas->TexWidth, atlas->TexHeight, char_idx, &dummy_x, &dummy_y, &q, 0);
                dst_font->AddGlyph((ImWchar)codepoint, q.x0 + off_x, q.y0 + off_y, q.x1 + off_x, q.y1 + off_y, q.s0, q.t0, q.s1, q.t1, pc.xadvance);
            }
        }
    }

    // Cleanup temporaries
    ImGui::MemFree(buf_packedchars);
    ImGui::MemFree(buf_ranges);
    ImGui::MemFree(tmp_array);

    ImFontAtlasBuildFinish(atlas);

    return true;
}